

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

PackageMempoolAcceptResult * __thiscall
anon_unknown.dwarf_3f1b8ca::MemPoolAccept::AcceptMultipleTransactions
          (PackageMempoolAcceptResult *__return_storage_ptr__,MemPoolAccept *this,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *txns,ATMPArgs *args)

{
  list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *replaced_txns;
  CAmount *pCVar1;
  size_t *psVar2;
  _Alloc_hider _Var3;
  pointer *pptVar4;
  PackageMempoolAcceptResult *pPVar5;
  element_type *peVar6;
  pointer pcVar7;
  size_t sVar8;
  CTransaction *tx;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  CTxMemPool *pCVar10;
  uint64_t mempool_sequence;
  ValidationSignals *this_00;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  PackageValidationState state;
  TxValidationState state_00;
  PackageValidationState state_01;
  PackageValidationState state_02;
  TxValidationState state_03;
  PackageValidationState state_04;
  TxValidationState state_05;
  PackageValidationState state_06;
  PackageValidationState state_07;
  TxValidationState state_08;
  PackageValidationState state_09;
  TxValidationState state_10;
  TxValidationState state_11;
  TxValidationState state_12;
  PackageValidationState state_13;
  PackageValidationState state_14;
  PackageValidationState state_15;
  pointer __first;
  undefined8 *puVar14;
  void *pvVar15;
  SubPackageState *pSVar16;
  CTxMemPool **ppCVar17;
  undefined1 uVar18;
  undefined7 uVar19;
  pointer psVar20;
  bool bVar21;
  byte bVar22;
  bool bVar23;
  bool bVar24;
  pointer pWVar25;
  CTransactionRef *pCVar26;
  ulong uVar27;
  pointer pWVar28;
  long lVar29;
  pointer psVar30;
  pointer pWVar31;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  undefined8 uVar32;
  undefined7 extraout_var_03;
  undefined7 extraout_var_04;
  undefined7 extraout_var_05;
  int64_t iVar33;
  _Base_ptr p_Var34;
  Logger *pLVar35;
  _Tp_alloc_type *p_Var36;
  string *all_conflicts;
  char *limits;
  Workspace *__args;
  Workspace *__args_00;
  long lVar37;
  Workspace *extraout_RDX;
  Workspace *extraout_RDX_00;
  Workspace *extraout_RDX_01;
  Workspace *extraout_RDX_02;
  Workspace *extraout_RDX_03;
  Workspace *extraout_RDX_04;
  Workspace *extraout_RDX_05;
  Workspace *extraout_RDX_06;
  Workspace *extraout_RDX_07;
  Workspace *extraout_RDX_08;
  Workspace *extraout_RDX_09;
  Workspace *extraout_RDX_10;
  Workspace *extraout_RDX_11;
  Workspace *extraout_RDX_12;
  Workspace *extraout_RDX_13;
  Workspace *extraout_RDX_14;
  Workspace *extraout_RDX_15;
  Workspace *extraout_RDX_16;
  Workspace *extraout_RDX_17;
  Workspace *extraout_RDX_18;
  Workspace *extraout_RDX_19;
  Workspace *extraout_RDX_20;
  Workspace *extraout_RDX_21;
  Workspace *pWVar38;
  Workspace *extraout_RDX_22;
  iterator __end1;
  _Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
  *p_Var39;
  CCoinsViewMemPool *this_01;
  MemPoolAccept *pMVar40;
  MemPoolAccept *pMVar41;
  int64_t *piVar42;
  ulong uVar43;
  ATMPArgs *args_00;
  PackageValidationState *state_16;
  size_type __n;
  byte *pbVar44;
  long *plVar45;
  CFeeRate relay_fee;
  setEntries *mempool_ancestors;
  ulong uVar46;
  long lVar47;
  pointer pWVar48;
  _Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
  *this_02;
  Package *package;
  iterator __begin1;
  pointer pWVar49;
  pointer __n_00;
  long *plVar50;
  CTransactionRef *pCVar51;
  pointer psVar52;
  long in_FS_OFFSET;
  initializer_list<std::pair<const_uint256,_MempoolAcceptResult>_> __l;
  initializer_list<transaction_identifier<true>_> __l_00;
  initializer_list<transaction_identifier<true>_> __l_01;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  undefined8 in_stack_fffffffffffff618;
  undefined4 in_stack_fffffffffffff620;
  undefined4 uVar53;
  uint uVar54;
  undefined4 in_stack_fffffffffffff624;
  undefined4 uVar55;
  pointer in_stack_fffffffffffff628;
  undefined8 in_stack_fffffffffffff630;
  ATMPArgs *pAVar56;
  undefined1 uVar57;
  undefined7 uVar58;
  undefined4 in_stack_fffffffffffff648;
  uint uVar59;
  undefined4 in_stack_fffffffffffff64c;
  SubPackageState *nFeePaid;
  undefined4 uVar60;
  pointer in_stack_fffffffffffff650;
  string *in_stack_fffffffffffff658;
  CFeeRate local_990;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
  all_package_wtxids;
  CFeeRate package_feerate;
  vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
  local_968;
  FeeEstimateMode local_948;
  FeeEstimateMode local_944;
  CFeeRate package_feerate_1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock8;
  undefined1 local_928 [8];
  long *local_920;
  long local_910 [2];
  long *local_900 [2];
  long local_8f0 [2];
  undefined1 local_8e0 [8];
  long *local_8d8;
  long local_8c8 [2];
  long *local_8b8 [2];
  long local_8a8 [2];
  undefined1 local_898 [8];
  long *local_890;
  long local_880 [2];
  long *local_870 [2];
  long local_860 [2];
  undefined1 local_850 [8];
  long *local_848;
  long local_838 [2];
  long *local_828 [2];
  long local_818 [2];
  undefined8 local_808;
  long *local_800 [2];
  long local_7f0 [2];
  long *local_7e0 [2];
  long local_7d0 [2];
  undefined1 local_7c0 [8];
  long *local_7b8;
  long local_7a8 [2];
  long *local_798 [2];
  long local_788 [2];
  undefined1 local_778 [8];
  long *local_770;
  long local_760 [2];
  long *local_750 [2];
  long local_740 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> err;
  string local_708 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_700;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6f0;
  _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_6e0 [3];
  _Storage<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false>
  local_698;
  bool local_680;
  undefined1 local_650 [8];
  long *local_648;
  long local_638 [2];
  long *local_628 [2];
  long local_618 [2];
  TxValidationState placeholder_state;
  undefined1 local_5c0 [8];
  _Base_ptr *local_5b8;
  _Base_ptr local_5a8 [2];
  long *local_598 [2];
  long local_588 [2];
  undefined1 local_578 [8];
  pointer local_570;
  _Base_ptr local_560 [2];
  long *local_550 [2];
  long local_540 [2];
  undefined8 local_530;
  long *local_528 [2];
  long local_518 [2];
  long *local_508 [2];
  long local_4f8 [2];
  undefined1 local_4e8 [8];
  pointer local_4e0;
  _Base_ptr local_4d0 [2];
  long *local_4c0 [2];
  long local_4b0 [2];
  undefined8 local_4a0;
  long *local_498 [2];
  long local_488 [2];
  long *local_478 [2];
  long local_468 [2];
  map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  results;
  undefined1 local_428 [8];
  _Base_ptr *local_420;
  _Base_ptr local_410 [2];
  long *local_400 [2];
  long local_3f0 [2];
  PackageValidationState package_state;
  Result<void> result;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_328;
  _Storage<CFeeRate,_true> local_310;
  _Head_base<0UL,_CTxMemPoolEntry_*,_false> _Stack_308;
  _Storage<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false>
  local_300;
  bool local_2e8;
  _Storage<uint256,_true> local_2e0;
  undefined1 local_2c0 [32];
  _Alloc_hider local_2a0;
  size_type local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  undefined1 local_280 [264];
  undefined1 local_178 [32];
  undefined1 local_158 [8];
  char *local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  long *local_130 [2];
  long local_120 [2];
  CFeeRate parent_feerate;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  undefined1 local_f0 [8];
  char *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  long *local_c8 [2];
  long local_b8 [2];
  size_type __dnew_1;
  undefined1 auStack_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90 [2];
  __index_type local_68;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
  effective_feerate_wtxids_1;
  
  pPVar5 = *(PackageMempoolAcceptResult **)(in_FS_OFFSET + 0x28);
  package_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                 field_2;
  package_state.super_ValidationState<PackageValidationResult>.m_mode = M_VALID;
  package_state.super_ValidationState<PackageValidationResult>.m_result = PCKG_RESULT_UNSET;
  package_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length = 0;
  package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._M_local_buf
  [0] = '\0';
  package_state.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                 field_2;
  package_state.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length = 0;
  package_state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._M_local_buf
  [0] = '\0';
  state_16 = &package_state;
  uVar57 = SUB81(txns,0);
  uVar58 = (undefined7)((ulong)txns >> 8);
  bVar21 = IsWellFormedPackage(txns,state_16,true);
  if (bVar21) {
    p_Var36 = (_Tp_alloc_type *)0x38e38e38e38e38;
    local_968.
    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_968.
    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_968.
    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pCVar51 = *(CTransactionRef **)CONCAT71(uVar58,uVar57);
    pCVar26 = (CTransactionRef *)((long *)CONCAT71(uVar58,uVar57))[1];
    p_Var39 = (_Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
               *)((long)pCVar26 - (long)pCVar51 >> 4);
    if ((_Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
         *)0x38e38e38e38e38 < p_Var39) {
      if (*(PackageMempoolAcceptResult **)(in_FS_OFFSET + 0x28) == pPVar5) {
        std::__throw_length_error("vector::reserve");
LAB_00af6774:
        if (*(PackageMempoolAcceptResult **)(in_FS_OFFSET + 0x28) == pPVar5) {
          std::__throw_bad_optional_access();
        }
      }
      goto LAB_00af7567;
    }
    if (pCVar26 != pCVar51) {
      pWVar25 = std::
                _Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                ::_M_allocate(p_Var39,(size_t)state_16);
      std::
      vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
      ::_S_relocate((pointer)0x0,(pointer)0x0,pWVar25,p_Var36);
      pCVar51 = *(CTransactionRef **)CONCAT71(uVar58,uVar57);
      pCVar26 = (CTransactionRef *)((long *)CONCAT71(uVar58,uVar57))[1];
      local_968.
      super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pWVar25 + (long)p_Var39;
      local_968.
      super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
      ._M_impl.super__Vector_impl_data._M_finish = pWVar25;
    }
    args_00 = args;
    pWVar25 = local_968.
              super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pWVar28 = local_968.
              super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pWVar31 = local_968.
              super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (pCVar51 != pCVar26) {
      in_stack_fffffffffffff648 = SUB84(pCVar26,0);
      in_stack_fffffffffffff64c = (undefined4)((ulong)pCVar26 >> 0x20);
      pWVar25 = local_968.
                super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      local_968.
      super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_968.
           super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      do {
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_4_ = 0;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
        _M_storage[0x10] = '\0';
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ = 0;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ =
             (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate> + 8;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
        _M_storage[0x18] =
             (uchar)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
             (undefined7)
             ((ulong)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ >> 8);
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._40_8_ = 0;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._56_4_ = 0;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_index = '\0';
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._65_7_ = 0;
        local_348._0_8_ =
             (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x38;
        local_348._8_8_ = (_List_node_base *)0x0;
        local_338._8_4_ = _S_red;
        local_328._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
        local_328._M_impl._M_node.super__List_node_base._M_prev =
             (_List_node_base *)((long)local_338 + 8);
        local_2e0._0_8_ = (void *)0x0;
        local_300._0_1_ = false;
        local_310 = (_Storage<CFeeRate,_true>)0x0;
        _Stack_308._M_head_impl = (CTxMemPoolEntry *)0x0;
        local_2e0._16_8_ =
             &((pCVar51->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
              ->hash;
        local_2e0._24_8_ = 0;
        local_2c0._0_8_ = local_2c0 + 0x10;
        local_2c0._8_8_ = 0;
        local_2c0[0x10] = '\0';
        local_2a0._M_p = (pointer)&local_290;
        local_298 = 0;
        local_290._M_local_buf[0] = '\0';
        local_328._M_impl._M_node._M_size =
             (size_t)local_328._M_impl._M_node.super__List_node_base._M_prev;
        local_2e0._8_8_ = pCVar51;
        memset(local_280,0,0x102);
        local_178._0_8_ = (pointer)0x0;
        local_178[8] = 0;
        local_178._9_7_ = 0;
        local_178[0x10] = 0;
        local_178._17_8_ = 0;
        if (pWVar28 == pWVar31) {
          uVar46 = (long)pWVar31 - (long)pWVar25;
          if (uVar46 == 0x7ffffffffffffe00) {
            local_968.
            super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
            ._M_impl.super__Vector_impl_data._M_start = pWVar25;
            local_968.
            super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
            ._M_impl.super__Vector_impl_data._M_finish = pWVar28;
            local_968.
            super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = pWVar31;
            if (*(PackageMempoolAcceptResult **)(in_FS_OFFSET + 0x28) != pPVar5) goto LAB_00af7567;
            std::__throw_length_error("vector::_M_realloc_insert");
            goto LAB_00af6735;
          }
          uVar27 = ((long)uVar46 >> 6) * -0x71c71c71c71c71c7;
          in_stack_fffffffffffff620 = SUB84(pWVar25,0);
          in_stack_fffffffffffff624 = (undefined4)((ulong)pWVar25 >> 0x20);
          uVar43 = uVar27;
          if (pWVar31 == pWVar25) {
            uVar43 = 1;
          }
          p_Var39 = (_Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                     *)(uVar43 + uVar27);
          if ((_Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
               *)0x38e38e38e38e37 < p_Var39) {
            p_Var39 = (_Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                       *)0x38e38e38e38e38;
          }
          p_Var36 = (_Tp_alloc_type *)(uVar43 + uVar27);
          this_02 = (_Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                     *)0x38e38e38e38e38;
          if (!CARRY8(uVar43,uVar27)) {
            this_02 = p_Var39;
          }
          pWVar25 = std::
                    _Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                    ::_M_allocate(this_02,0x38e38e38e38e38);
          std::allocator_traits<std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>::
          construct<(anonymous_namespace)::MemPoolAccept::Workspace,(anonymous_namespace)::MemPoolAccept::Workspace>
                    ((allocator_type *)((long)pWVar25 + uVar46),(Workspace *)&result,__args_00);
          __first = (pointer)CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620);
          pWVar28 = std::
                    vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                    ::_S_relocate(__first,pWVar28,pWVar25,p_Var36);
          args = args_00;
          if (__first != (pointer)0x0) {
            operator_delete(__first,uVar46);
            args = args_00;
          }
          pWVar31 = pWVar25 + (long)this_02;
          in_stack_fffffffffffff628 = pWVar28;
          args_00 = args;
        }
        else {
          std::allocator_traits<std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>::
          construct<(anonymous_namespace)::MemPoolAccept::Workspace,(anonymous_namespace)::MemPoolAccept::Workspace>
                    ((allocator_type *)pWVar28,(Workspace *)&result,__args);
        }
        std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                  ((vector<CTxOut,_std::allocator<CTxOut>_> *)local_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_p != &local_290) {
          operator_delete(local_2a0._M_p,
                          CONCAT71(local_290._M_allocated_capacity._1_7_,local_290._M_local_buf[0])
                          + 1);
        }
        if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
          operator_delete((void *)local_2c0._0_8_,CONCAT71(local_2c0._17_7_,local_2c0[0x10]) + 1);
        }
        if (_Stack_308._M_head_impl != (CTxMemPoolEntry *)0x0) {
          std::default_delete<CTxMemPoolEntry>::operator()
                    ((default_delete<CTxMemPoolEntry> *)&_Stack_308,_Stack_308._M_head_impl);
        }
        pWVar28 = pWVar28 + 1;
        _Stack_308._M_head_impl = (CTxMemPoolEntry *)0x0;
        std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)local_338);
        std::_Rb_tree<$270907ca$>::~_Rb_tree
                  ((_Rb_tree<_270907ca_> *)
                   ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                           super__Move_assign_alias<bilingual_str,_std::monostate>.
                           super__Copy_assign_alias<bilingual_str,_std::monostate>.
                           super__Move_ctor_alias<bilingual_str,_std::monostate>.
                           super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x30));
        std::
        _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                     *)&result);
        pCVar51 = pCVar51 + 1;
      } while (pCVar51 !=
               (CTransactionRef *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
    }
    local_968.
    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pWVar31;
    local_968.
    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ._M_impl.super__Vector_impl_data._M_finish = pWVar28;
    local_968.
    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ._M_impl.super__Vector_impl_data._M_start = pWVar25;
    pWVar28 = local_968.
              super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pWVar25 = local_968.
              super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
              ._M_impl.super__Vector_impl_data._M_start;
    results._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &results._M_t._M_impl.super__Rb_tree_header._M_header;
    results._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    results._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    results._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    criticalblock8.super_unique_lock._M_device = &(this->m_pool->cs).super_recursive_mutex;
    criticalblock8.super_unique_lock._M_owns = false;
    pMVar41 = this;
    results._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         results._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::unique_lock<std::recursive_mutex>::lock(&criticalblock8.super_unique_lock);
    pWVar31 = pWVar25;
    pWVar49 = pWVar28;
    if (pWVar25 != pWVar28) {
      this_01 = &this->m_viewmempool;
      this = pMVar41;
      do {
        bVar21 = PreChecks(this,args,pWVar25);
        if (!bVar21) {
          pvVar15 = (void *)((long)&result.m_variant.
                                    super__Variant_base<bilingual_str,_std::monostate>.
                                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x10);
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
          _M_storage[0] = (uchar)pvVar15;
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
               (undefined7)((ulong)pvVar15 >> 8);
          std::__cxx11::string::_M_construct<char_const*>((string *)&result,"transaction failed","")
          ;
          _Var3._M_p = (pointer)((long)&err.
                                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                        ._M_payload.
                                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                        .
                                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ._M_payload + 0x10);
          err.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)_Var3._M_p;
          std::__cxx11::string::_M_construct<char_const*>((string *)&err,"");
          ValidationState<PackageValidationResult>::Invalid
                    (&package_state.super_ValidationState<PackageValidationResult>,PCKG_TX,
                     (string *)&result,(string *)&err);
          if (err.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_dataplus._M_p != (_Alloc_hider)_Var3._M_p) {
            operator_delete((void *)err.
                                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ._M_payload._M_value._M_dataplus._M_p,
                            err.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._16_8_ + 1);
          }
          if ((void *)CONCAT71(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                               super__Move_assign_alias<bilingual_str,_std::monostate>.
                               super__Copy_assign_alias<bilingual_str,_std::monostate>.
                               super__Move_ctor_alias<bilingual_str,_std::monostate>.
                               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                               super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                               _1_7_,result.m_variant.
                                     super__Variant_base<bilingual_str,_std::monostate>.
                                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                     _M_u._M_first._M_storage._M_storage[0]) != pvVar15) {
            operator_delete((void *)CONCAT71(result.m_variant.
                                             super__Variant_base<bilingual_str,_std::monostate>.
                                             super__Move_assign_alias<bilingual_str,_std::monostate>
                                             .
                                             super__Copy_assign_alias<bilingual_str,_std::monostate>
                                             .super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                             super__Variant_storage_alias<bilingual_str,_std::monostate>
                                             ._M_u._1_7_,
                                             result.m_variant.
                                             super__Variant_base<bilingual_str,_std::monostate>.
                                             super__Move_assign_alias<bilingual_str,_std::monostate>
                                             .
                                             super__Copy_assign_alias<bilingual_str,_std::monostate>
                                             .super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                             super__Variant_storage_alias<bilingual_str,_std::monostate>
                                             ._M_u._M_first._M_storage._M_storage[0]),
                            CONCAT71(result.m_variant.
                                     super__Variant_base<bilingual_str,_std::monostate>.
                                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                     _M_u._17_7_,
                                     result.m_variant.
                                     super__Variant_base<bilingual_str,_std::monostate>.
                                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                     _M_u._M_first._M_storage._M_storage[0x10]) + 1);
          }
          peVar6 = (pWVar25->m_ptx->
                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_4a0._0_4_ = (pWVar25->m_state).super_ValidationState<TxValidationResult>.m_mode;
          local_4a0._4_4_ = (pWVar25->m_state).super_ValidationState<TxValidationResult>.m_result;
          pcVar7 = (pWVar25->m_state).super_ValidationState<TxValidationResult>.m_reject_reason.
                   _M_dataplus._M_p;
          local_498[0] = local_488;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_498,pcVar7,
                     pcVar7 + (pWVar25->m_state).super_ValidationState<TxValidationResult>.
                              m_reject_reason._M_string_length);
          pcVar7 = (pWVar25->m_state).super_ValidationState<TxValidationResult>.m_debug_message.
                   _M_dataplus._M_p;
          local_478[0] = local_468;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_478,pcVar7,
                     pcVar7 + (pWVar25->m_state).super_ValidationState<TxValidationResult>.
                              m_debug_message._M_string_length);
          state_00.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p._0_4_
               = in_stack_fffffffffffff620;
          state_00.super_ValidationState<TxValidationResult>._0_8_ = this;
          state_00.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p._4_4_
               = in_stack_fffffffffffff624;
          state_00.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length =
               (size_type)in_stack_fffffffffffff628;
          state_00.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity = (size_type)args_00;
          state_00.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_local_buf[8]
               = uVar57;
          state_00.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._9_7_ = uVar58;
          state_00.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
               (pointer)__return_storage_ptr__;
          state_00.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length._0_4_
               = in_stack_fffffffffffff648;
          state_00.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length._4_4_
               = in_stack_fffffffffffff64c;
          state_00.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
          _M_allocated_capacity = (size_type)in_stack_fffffffffffff650;
          state_00.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
               in_stack_fffffffffffff658;
          MempoolAcceptResult::Failure((MempoolAcceptResult *)&result,state_00);
          std::
          _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
          ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                    ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                      *)&results,&peVar6->m_witness_hash,(MempoolAcceptResult *)&result);
          if (local_2e8 == true) {
            local_2e8 = false;
            pvVar15 = (void *)CONCAT71(local_300._1_7_,local_300._0_1_);
            if (pvVar15 != (void *)0x0) {
              operator_delete(pvVar15,(long)local_300._M_value.
                                            super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)pvVar15);
            }
          }
          std::__cxx11::
          _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      *)local_348);
          if ((__index_type *)
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._48_8_ !=
              (__index_type *)
              ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                      super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x40U)) {
            operator_delete((void *)result.m_variant.
                                    super__Variant_base<bilingual_str,_std::monostate>.
                                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u
                                    ._48_8_,
                            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                            super__Variant_storage_alias<bilingual_str,_std::monostate>._64_8_ + 1);
          }
          if ((void *)CONCAT71(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                               super__Move_assign_alias<bilingual_str,_std::monostate>.
                               super__Copy_assign_alias<bilingual_str,_std::monostate>.
                               super__Move_ctor_alias<bilingual_str,_std::monostate>.
                               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                               super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                               _17_7_,result.m_variant.
                                      super__Variant_base<bilingual_str,_std::monostate>.
                                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                      super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                      _M_u._M_first._M_storage._M_storage[0x10]) !=
              (void *)((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x20U)) {
            operator_delete((void *)CONCAT71(result.m_variant.
                                             super__Variant_base<bilingual_str,_std::monostate>.
                                             super__Move_assign_alias<bilingual_str,_std::monostate>
                                             .
                                             super__Copy_assign_alias<bilingual_str,_std::monostate>
                                             .super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                             super__Variant_storage_alias<bilingual_str,_std::monostate>
                                             ._M_u._17_7_,
                                             result.m_variant.
                                             super__Variant_base<bilingual_str,_std::monostate>.
                                             super__Move_assign_alias<bilingual_str,_std::monostate>
                                             .
                                             super__Copy_assign_alias<bilingual_str,_std::monostate>
                                             .super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                             super__Variant_storage_alias<bilingual_str,_std::monostate>
                                             ._M_u._M_first._M_storage._M_storage[0x10]),
                            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_
                            + 1);
          }
          if (local_478[0] != local_468) {
            operator_delete(local_478[0],local_468[0] + 1);
          }
          if (local_498[0] != local_488) {
            operator_delete(local_498[0],local_488[0] + 1);
          }
          local_4e8._0_4_ = package_state.super_ValidationState<PackageValidationResult>.m_mode;
          local_4e8._4_4_ = package_state.super_ValidationState<PackageValidationResult>.m_result;
          local_4e0 = (pointer)local_4d0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4e0,
                     package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                     _M_dataplus._M_p,
                     package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                     _M_dataplus._M_p +
                     package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                     _M_string_length);
          local_4c0[0] = local_4b0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4c0,
                     package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                     _M_dataplus._M_p,
                     package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                     _M_dataplus._M_p +
                     package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                     _M_string_length);
          state_01.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p.
          _0_4_ = in_stack_fffffffffffff620;
          state_01.super_ValidationState<PackageValidationResult>._0_8_ = this;
          state_01.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p.
          _4_4_ = in_stack_fffffffffffff624;
          state_01.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
               (size_type)in_stack_fffffffffffff628;
          state_01.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity = (size_type)args_00;
          state_01.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
          _M_local_buf[8] = uVar57;
          state_01.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._9_7_ =
               uVar58;
          state_01.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
               (pointer)__return_storage_ptr__;
          state_01.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length.
          _0_4_ = in_stack_fffffffffffff648;
          state_01.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length.
          _4_4_ = in_stack_fffffffffffff64c;
          state_01.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
          _M_allocated_capacity = (size_type)in_stack_fffffffffffff650;
          state_01.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
               in_stack_fffffffffffff658;
          PackageMempoolAcceptResult::PackageMempoolAcceptResult
                    (__return_storage_ptr__,state_01,
                     (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                      *)local_4e8);
          if (local_4c0[0] != local_4b0) {
            operator_delete(local_4c0[0],local_4b0[0] + 1);
          }
          uVar32 = local_4e0;
          if (local_4e0 == (pointer)local_4d0) goto LAB_00af666b;
          goto LAB_00af40a0;
        }
        if ((args->m_client_maxfeerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
            super__Optional_payload_base<CFeeRate>._M_engaged == true) {
          CFeeRate::CFeeRate((CFeeRate *)&result,&pWVar25->m_modified_fees,
                             (uint32_t)pWVar25->m_vsize);
          if ((args->m_client_maxfeerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
              super__Optional_payload_base<CFeeRate>._M_engaged == false) goto LAB_00af6735;
          if ((long)(args->m_client_maxfeerate).super__Optional_base<CFeeRate,_true,_true>.
                    _M_payload.super__Optional_payload_base<CFeeRate>._M_payload <
              CONCAT71(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_,
                       result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first.
                       _M_storage._M_storage[0])) {
            pvVar15 = (void *)((long)&result.m_variant.
                                      super__Variant_base<bilingual_str,_std::monostate>.
                                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                      super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x10);
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
            _M_storage[0] = (uchar)pvVar15;
            uVar18 = result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first.
                     _M_storage._M_storage[0];
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                 (undefined7)((ulong)pvVar15 >> 8);
            uVar19 = result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&result,"max feerate exceeded","");
            _Var3._M_p = (pointer)((long)&err.
                                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ._M_payload + 0x10);
            err.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)_Var3._M_p;
            std::__cxx11::string::_M_construct<char_const*>((string *)&err,"");
            ValidationState<TxValidationResult>::Invalid
                      (&(pWVar25->m_state).super_ValidationState<TxValidationResult>,
                       TX_MEMPOOL_POLICY,(string *)&result,(string *)&err);
            if (err.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_payload._M_value._M_dataplus._M_p != (_Alloc_hider)_Var3._M_p) {
              operator_delete((void *)err.
                                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ._M_payload._M_value._M_dataplus._M_p,
                              err.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload._16_8_ + 1);
            }
            if ((void *)CONCAT71(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>
                                 .super__Move_assign_alias<bilingual_str,_std::monostate>.
                                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                 super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                 _1_7_,result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._M_first._M_storage._M_storage[0]) != pvVar15) {
              operator_delete((void *)CONCAT71(result.m_variant.
                                               super__Variant_base<bilingual_str,_std::monostate>.
                                               super__Move_assign_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Copy_assign_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Move_ctor_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Variant_storage_alias<bilingual_str,_std::monostate>
                                               ._M_u._1_7_,
                                               result.m_variant.
                                               super__Variant_base<bilingual_str,_std::monostate>.
                                               super__Move_assign_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Copy_assign_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Move_ctor_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Variant_storage_alias<bilingual_str,_std::monostate>
                                               ._M_u._M_first._M_storage._M_storage[0]),
                              CONCAT71(result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._17_7_,
                                       result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._M_first._M_storage._M_storage[0x10]) + 1);
            }
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
            _M_storage[0] = uVar18;
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ = uVar19;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&result,"transaction failed","");
            err.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)_Var3._M_p;
            std::__cxx11::string::_M_construct<char_const*>((string *)&err,"");
            ValidationState<PackageValidationResult>::Invalid
                      (&package_state.super_ValidationState<PackageValidationResult>,PCKG_TX,
                       (string *)&result,(string *)&err);
            if (err.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_payload._M_value._M_dataplus._M_p != (_Alloc_hider)_Var3._M_p) {
              operator_delete((void *)err.
                                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ._M_payload._M_value._M_dataplus._M_p,
                              err.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload._16_8_ + 1);
            }
            if ((void *)CONCAT71(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>
                                 .super__Move_assign_alias<bilingual_str,_std::monostate>.
                                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                 super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                 _1_7_,result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._M_first._M_storage._M_storage[0]) != pvVar15) {
              operator_delete((void *)CONCAT71(result.m_variant.
                                               super__Variant_base<bilingual_str,_std::monostate>.
                                               super__Move_assign_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Copy_assign_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Move_ctor_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Variant_storage_alias<bilingual_str,_std::monostate>
                                               ._M_u._1_7_,
                                               result.m_variant.
                                               super__Variant_base<bilingual_str,_std::monostate>.
                                               super__Move_assign_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Copy_assign_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Move_ctor_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Variant_storage_alias<bilingual_str,_std::monostate>
                                               ._M_u._M_first._M_storage._M_storage[0]),
                              CONCAT71(result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._17_7_,
                                       result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._M_first._M_storage._M_storage[0x10]) + 1);
            }
            peVar6 = (pWVar25->m_ptx->
                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            local_530._0_4_ = (pWVar25->m_state).super_ValidationState<TxValidationResult>.m_mode;
            local_530._4_4_ = (pWVar25->m_state).super_ValidationState<TxValidationResult>.m_result;
            pcVar7 = (pWVar25->m_state).super_ValidationState<TxValidationResult>.m_reject_reason.
                     _M_dataplus._M_p;
            local_528[0] = local_518;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_528,pcVar7,
                       pcVar7 + (pWVar25->m_state).super_ValidationState<TxValidationResult>.
                                m_reject_reason._M_string_length);
            pcVar7 = (pWVar25->m_state).super_ValidationState<TxValidationResult>.m_debug_message.
                     _M_dataplus._M_p;
            local_508[0] = local_4f8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_508,pcVar7,
                       pcVar7 + (pWVar25->m_state).super_ValidationState<TxValidationResult>.
                                m_debug_message._M_string_length);
            state_03.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p.
            _0_4_ = in_stack_fffffffffffff620;
            state_03.super_ValidationState<TxValidationResult>._0_8_ = this;
            state_03.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p.
            _4_4_ = in_stack_fffffffffffff624;
            state_03.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length =
                 (size_type)in_stack_fffffffffffff628;
            state_03.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
            _M_allocated_capacity = (size_type)args_00;
            state_03.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_local_buf
            [8] = uVar57;
            state_03.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._9_7_ =
                 uVar58;
            state_03.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
                 (pointer)__return_storage_ptr__;
            state_03.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length.
            _0_4_ = in_stack_fffffffffffff648;
            state_03.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length.
            _4_4_ = in_stack_fffffffffffff64c;
            state_03.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
            _M_allocated_capacity = (size_type)in_stack_fffffffffffff650;
            state_03.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
                 in_stack_fffffffffffff658;
            MempoolAcceptResult::Failure((MempoolAcceptResult *)&result,state_03);
            std::
            _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
            ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                      ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                        *)&results,&peVar6->m_witness_hash,(MempoolAcceptResult *)&result);
            if (local_2e8 == true) {
              local_2e8 = false;
              pvVar15 = (void *)CONCAT71(local_300._1_7_,local_300._0_1_);
              if (pvVar15 != (void *)0x0) {
                operator_delete(pvVar15,(long)local_300._M_value.
                                              super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)pvVar15);
              }
            }
            std::__cxx11::
            _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        *)local_348);
            if ((__index_type *)
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._48_8_ !=
                (__index_type *)
                ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x40U)) {
              operator_delete((void *)result.m_variant.
                                      super__Variant_base<bilingual_str,_std::monostate>.
                                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                      super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                      _M_u._48_8_,
                              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate>._64_8_ + 1
                             );
            }
            if ((void *)CONCAT71(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>
                                 .super__Move_assign_alias<bilingual_str,_std::monostate>.
                                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                 super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                 _17_7_,result.m_variant.
                                        super__Variant_base<bilingual_str,_std::monostate>.
                                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                        super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                        _M_u._M_first._M_storage._M_storage[0x10]) !=
                (void *)((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x20U)) {
              operator_delete((void *)CONCAT71(result.m_variant.
                                               super__Variant_base<bilingual_str,_std::monostate>.
                                               super__Move_assign_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Copy_assign_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Move_ctor_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Variant_storage_alias<bilingual_str,_std::monostate>
                                               ._M_u._17_7_,
                                               result.m_variant.
                                               super__Variant_base<bilingual_str,_std::monostate>.
                                               super__Move_assign_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Copy_assign_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Move_ctor_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Variant_storage_alias<bilingual_str,_std::monostate>
                                               ._M_u._M_first._M_storage._M_storage[0x10]),
                              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                              _32_8_ + 1);
            }
            if (local_508[0] != local_4f8) {
              operator_delete(local_508[0],local_4f8[0] + 1);
            }
            if (local_528[0] != local_518) {
              operator_delete(local_528[0],local_518[0] + 1);
            }
            local_578._0_4_ = package_state.super_ValidationState<PackageValidationResult>.m_mode;
            local_578._4_4_ = package_state.super_ValidationState<PackageValidationResult>.m_result;
            local_570 = (pointer)local_560;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_570,
                       package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                       _M_dataplus._M_p,
                       package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                       _M_dataplus._M_p +
                       package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                       _M_string_length);
            local_550[0] = local_540;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_550,
                       package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                       _M_dataplus._M_p,
                       package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                       _M_dataplus._M_p +
                       package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                       _M_string_length);
            state_04.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p
            ._0_4_ = in_stack_fffffffffffff620;
            state_04.super_ValidationState<PackageValidationResult>._0_8_ = this;
            state_04.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p
            ._4_4_ = in_stack_fffffffffffff624;
            state_04.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length
                 = (size_type)in_stack_fffffffffffff628;
            state_04.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
            _M_allocated_capacity = (size_type)args_00;
            state_04.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
            _M_local_buf[8] = uVar57;
            state_04.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._9_7_ =
                 uVar58;
            state_04.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p
                 = (pointer)__return_storage_ptr__;
            state_04.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length
            ._0_4_ = in_stack_fffffffffffff648;
            state_04.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length
            ._4_4_ = in_stack_fffffffffffff64c;
            state_04.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
            _M_allocated_capacity = (size_type)in_stack_fffffffffffff650;
            state_04.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
                 in_stack_fffffffffffff658;
            PackageMempoolAcceptResult::PackageMempoolAcceptResult
                      (__return_storage_ptr__,state_04,
                       (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                        *)local_578);
            if (local_550[0] != local_540) {
              operator_delete(local_550[0],local_540[0] + 1);
            }
            local_4d0[0] = local_560[0];
            uVar32 = local_570;
            if (local_570 == (pointer)local_560) goto LAB_00af666b;
            goto LAB_00af40a0;
          }
        }
        CCoinsViewMemPool::PackageAddTransaction(this_01,pWVar25->m_ptx);
        pWVar25 = pWVar25 + 1;
        pWVar31 = local_968.
                  super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pWVar49 = local_968.
                  super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pMVar41 = this;
      } while (pWVar25 != pWVar28);
    }
    pWVar25 = pWVar49;
    if (pWVar31 == pWVar49) {
LAB_00af35a8:
      if (pWVar31 == pWVar25) {
        (this->m_subpackage).m_total_vsize = 0;
        lVar37 = 0;
        lVar29 = 0;
      }
      else {
        lVar37 = 0;
        pWVar28 = pWVar31;
        do {
          lVar37 = lVar37 + pWVar28->m_vsize;
          pWVar28 = pWVar28 + 1;
        } while (pWVar28 != pWVar25);
        (this->m_subpackage).m_total_vsize = lVar37;
        lVar29 = 0;
        pWVar28 = pWVar31;
        do {
          lVar29 = lVar29 + pWVar28->m_modified_fees;
          pWVar28 = pWVar28 + 1;
        } while (pWVar28 != pWVar25);
      }
      piVar42 = &(this->m_subpackage).m_total_vsize;
      nFeePaid = &this->m_subpackage;
      (this->m_subpackage).m_total_modified_fees = lVar29;
      CFeeRate::CFeeRate(&package_feerate,&nFeePaid->m_total_modified_fees,(uint32_t)lVar37);
      all_package_wtxids.
      super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      all_package_wtxids.
      super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      all_package_wtxids.
      super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar29 = (long)pWVar25 - (long)pWVar31;
      __n = (lVar29 >> 6) * -0x71c71c71c71c71c7;
      std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
      reserve(&all_package_wtxids,__n);
      uVar53 = SUB84(pWVar31,0);
      uVar55 = (undefined4)((ulong)pWVar31 >> 0x20);
      pWVar38 = extraout_RDX;
      if (pWVar31 != pWVar25) {
        do {
          peVar6 = (pWVar31->m_ptx->
                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          uVar32 = *(undefined8 *)
                    (peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
          uVar11 = *(undefined8 *)
                    ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                    + 8);
          uVar12 = *(undefined8 *)
                    ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                    + 0x10);
          uVar13 = *(undefined8 *)
                    ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                    + 0x18);
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
          _M_storage[0x10] = (uchar)uVar12;
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
               (undefined7)((ulong)uVar12 >> 8);
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
          _M_storage[0x18] = (uchar)uVar13;
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
               (undefined7)((ulong)uVar13 >> 8);
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
          _M_storage[0] = (uchar)uVar32;
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
               (undefined7)((ulong)uVar32 >> 8);
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_4_ =
               (undefined4)uVar11;
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
               (undefined4)((ulong)uVar11 >> 0x20);
          if (all_package_wtxids.
              super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              all_package_wtxids.
              super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>::
            _M_realloc_insert<transaction_identifier<true>>
                      ((vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>
                        *)&all_package_wtxids,
                       (iterator)
                       all_package_wtxids.
                       super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (transaction_identifier<true> *)&result);
            pWVar38 = extraout_RDX_00;
          }
          else {
            uVar32 = *(undefined8 *)
                      (peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
            uVar11 = *(undefined8 *)
                      ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                             _M_elems + 8);
            uVar12 = *(undefined8 *)
                      ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                             _M_elems + 0x18);
            *(undefined8 *)
             (((all_package_wtxids.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->m_wrapped).super_base_blob<256U>.m_data
              ._M_elems + 0x10) =
                 *(undefined8 *)
                  ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                  0x10);
            *(undefined8 *)
             (((all_package_wtxids.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->m_wrapped).super_base_blob<256U>.m_data
              ._M_elems + 0x18) = uVar12;
            *(undefined8 *)
             ((all_package_wtxids.
               super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->m_wrapped).super_base_blob<256U>.m_data.
             _M_elems = uVar32;
            *(undefined8 *)
             (((all_package_wtxids.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->m_wrapped).super_base_blob<256U>.m_data
              ._M_elems + 8) = uVar11;
            all_package_wtxids.
            super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 all_package_wtxids.
                 super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          pWVar31 = pWVar31 + 1;
        } while (pWVar31 != pWVar25);
      }
      placeholder_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
           (pointer)&placeholder_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                     field_2;
      placeholder_state.super_ValidationState<TxValidationResult>.m_mode = M_VALID;
      placeholder_state.super_ValidationState<TxValidationResult>.m_result = TX_RESULT_UNSET;
      placeholder_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length =
           0;
      placeholder_state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
      _M_local_buf[0] = '\0';
      placeholder_state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
           (pointer)&placeholder_state.super_ValidationState<TxValidationResult>.m_debug_message.
                     field_2;
      placeholder_state.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
           0;
      placeholder_state.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
      _M_local_buf[0] = '\0';
      package = (Package *)CONCAT71(uVar58,uVar57);
      limits = placeholder_state.super_ValidationState<TxValidationResult>.m_debug_message.
               _M_dataplus._M_p;
      if (args->m_package_feerates == true) {
        limits = (char *)&placeholder_state;
        bVar21 = CheckFeeRate(pMVar41,(pMVar41->m_subpackage).m_total_vsize,
                              (pMVar41->m_subpackage).m_total_modified_fees,
                              (TxValidationState *)limits);
        pWVar38 = extraout_RDX_01;
        if (bVar21) goto LAB_00af3b9a;
        pvVar15 = (void *)((long)&result.m_variant.
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x10);
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
        _M_storage[0] = (uchar)pvVar15;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
             (undefined7)((ulong)pvVar15 >> 8);
        std::__cxx11::string::_M_construct<char_const*>((string *)&result,"transaction failed","");
        _Var3._M_p = (pointer)((long)&err.
                                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ._M_payload + 0x10);
        err.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)_Var3._M_p;
        std::__cxx11::string::_M_construct<char_const*>((string *)&err,"");
        ValidationState<PackageValidationResult>::Invalid
                  (&package_state.super_ValidationState<PackageValidationResult>,PCKG_TX,
                   (string *)&result,(string *)&err);
        if (err.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_dataplus._M_p != (_Alloc_hider)_Var3._M_p) {
          operator_delete((void *)err.
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload._M_value._M_dataplus._M_p,
                          err.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._16_8_ + 1);
        }
        if ((void *)CONCAT71(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                             super__Move_assign_alias<bilingual_str,_std::monostate>.
                             super__Copy_assign_alias<bilingual_str,_std::monostate>.
                             super__Move_ctor_alias<bilingual_str,_std::monostate>.
                             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                             super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_,
                             result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                             super__Move_assign_alias<bilingual_str,_std::monostate>.
                             super__Copy_assign_alias<bilingual_str,_std::monostate>.
                             super__Move_ctor_alias<bilingual_str,_std::monostate>.
                             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                             super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                             _M_first._M_storage._M_storage[0]) != pvVar15) {
          operator_delete((void *)CONCAT71(result.m_variant.
                                           super__Variant_base<bilingual_str,_std::monostate>.
                                           super__Move_assign_alias<bilingual_str,_std::monostate>.
                                           super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                           super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                           super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                           super__Variant_storage_alias<bilingual_str,_std::monostate>
                                           ._M_u._1_7_,
                                           result.m_variant.
                                           super__Variant_base<bilingual_str,_std::monostate>.
                                           super__Move_assign_alias<bilingual_str,_std::monostate>.
                                           super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                           super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                           super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                           super__Variant_storage_alias<bilingual_str,_std::monostate>
                                           ._M_u._M_first._M_storage._M_storage[0]),
                          CONCAT71(result.m_variant.
                                   super__Variant_base<bilingual_str,_std::monostate>.
                                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                   super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                   _17_7_,result.m_variant.
                                          super__Variant_base<bilingual_str,_std::monostate>.
                                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                          super__Variant_storage_alias<bilingual_str,_std::monostate>
                                          ._M_u._M_first._M_storage._M_storage[0x10]) + 1);
        }
        local_650._0_4_ = package_state.super_ValidationState<PackageValidationResult>.m_mode;
        local_650._4_4_ = package_state.super_ValidationState<PackageValidationResult>.m_result;
        plVar50 = local_638;
        local_648 = plVar50;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_648,
                   package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                   _M_dataplus._M_p,
                   package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                   _M_dataplus._M_p +
                   package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                   _M_string_length);
        local_628[0] = local_618;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_628,
                   package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                   _M_dataplus._M_p,
                   package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                   _M_dataplus._M_p +
                   package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                   _M_string_length);
        peVar6 = ((pWVar25[-1].m_ptx)->
                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_778._0_4_ = placeholder_state.super_ValidationState<TxValidationResult>.m_mode;
        local_778._4_4_ = placeholder_state.super_ValidationState<TxValidationResult>.m_result;
        local_770 = local_760;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_770,
                   placeholder_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                   _M_dataplus._M_p,
                   placeholder_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                   _M_dataplus._M_p +
                   placeholder_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                   _M_string_length);
        local_750[0] = local_740;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_750,
                   placeholder_state.super_ValidationState<TxValidationResult>.m_debug_message.
                   _M_dataplus._M_p,
                   placeholder_state.super_ValidationState<TxValidationResult>.m_debug_message.
                   _M_dataplus._M_p +
                   placeholder_state.super_ValidationState<TxValidationResult>.m_debug_message.
                   _M_string_length);
        CFeeRate::CFeeRate(&local_990,&nFeePaid->m_total_modified_fees,(uint32_t)*piVar42);
        state_05.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p._0_4_ =
             uVar53;
        state_05.super_ValidationState<TxValidationResult>._0_8_ = pMVar41;
        state_05.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p._4_4_ =
             uVar55;
        state_05.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length = __n;
        state_05.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity = (size_type)args_00;
        state_05.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_local_buf[8] =
             uVar57;
        state_05.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._9_7_ = uVar58;
        state_05.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
             (pointer)__return_storage_ptr__;
        state_05.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length._0_4_ =
             (int)nFeePaid;
        state_05.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length._4_4_ =
             (int)((ulong)nFeePaid >> 0x20);
        state_05.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
        _M_allocated_capacity = (size_type)in_stack_fffffffffffff650;
        state_05.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
             in_stack_fffffffffffff658;
        MempoolAcceptResult::FeeFailure
                  ((MempoolAcceptResult *)&err,state_05,(CFeeRate)local_778,
                   (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                    *)local_990.nSatoshisPerK);
        uVar32 = *(undefined8 *)
                  (peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        uVar11 = *(undefined8 *)
                  ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                  8);
        uVar12 = *(undefined8 *)
                  ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                  0x10);
        uVar13 = *(undefined8 *)
                  ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                  0x18);
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
        _M_storage[0x10] = (uchar)uVar12;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
             (undefined7)((ulong)uVar12 >> 8);
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
        _M_storage[0x18] = (uchar)uVar13;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
             (undefined7)((ulong)uVar13 >> 8);
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
        _M_storage[0] = (uchar)uVar32;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
             (undefined7)((ulong)uVar32 >> 8);
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_4_ = (undefined4)uVar11;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
             (undefined4)((ulong)uVar11 >> 0x20);
        MempoolAcceptResult::MempoolAcceptResult
                  ((MempoolAcceptResult *)
                   ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                           super__Move_assign_alias<bilingual_str,_std::monostate>.
                           super__Copy_assign_alias<bilingual_str,_std::monostate>.
                           super__Move_ctor_alias<bilingual_str,_std::monostate>.
                           super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x20),
                   (MempoolAcceptResult *)&err);
        __l._M_len = 1;
        __l._M_array = (iterator)&result;
        std::
        map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
        ::map((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
               *)&__dnew_1,__l,(less<uint256> *)local_f0,(allocator_type *)local_158);
        state_06.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p.
        _0_4_ = uVar53;
        state_06.super_ValidationState<PackageValidationResult>._0_8_ = pMVar41;
        state_06.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p.
        _4_4_ = uVar55;
        state_06.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
             __n;
        state_06.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity = (size_type)args_00;
        state_06.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._M_local_buf
        [8] = uVar57;
        state_06.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._9_7_ =
             uVar58;
        state_06.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
             (pointer)__return_storage_ptr__;
        state_06.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length.
        _0_4_ = (int)nFeePaid;
        state_06.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length.
        _4_4_ = (int)((ulong)nFeePaid >> 0x20);
        state_06.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
        _M_allocated_capacity = (size_type)in_stack_fffffffffffff650;
        state_06.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
             in_stack_fffffffffffff658;
        PackageMempoolAcceptResult::PackageMempoolAcceptResult
                  (__return_storage_ptr__,state_06,
                   (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                    *)local_650);
        std::
        _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
        ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                     *)&__dnew_1);
        if ((local_2e0._M_value.super_base_blob<256U>.m_data._M_elems[0x18] == M_INVALID) &&
           (local_2e0._24_8_ = local_2e0._24_8_ & 0xffffffffffffff00,
           (void *)local_2e0._0_8_ != (void *)0x0)) {
          operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ - local_2e0._0_8_);
        }
        std::__cxx11::
        _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::_M_clear(&local_328);
        if ((_Base_ptr)local_348._0_8_ != (_Base_ptr)local_338) {
          operator_delete((void *)local_348._0_8_,local_338._0_8_ + 1);
        }
        if ((__index_type *)
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._48_8_ !=
            (__index_type *)
            ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x40U)) {
          operator_delete((void *)result.m_variant.
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                  _48_8_,
                          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                          super__Variant_storage_alias<bilingual_str,_std::monostate>._64_8_ + 1);
        }
        if ((local_680 == true) &&
           (local_680 = false,
           local_698._M_value.
           super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
           ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
          operator_delete(local_698._M_value.
                          super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_698._M_value.
                                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage - local_698._0_8_
                         );
        }
        std::__cxx11::
        _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::_M_clear(local_6e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_700._M_allocated_capacity != &local_6f0) {
          operator_delete((void *)local_700._M_allocated_capacity,
                          local_6f0._M_allocated_capacity + 1);
        }
        if ((bool *)err.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._16_8_ !=
            &err.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_engaged) {
          operator_delete((void *)err.
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload._16_8_,
                          err.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._32_8_ + 1);
        }
        if (local_750[0] != local_740) {
          operator_delete(local_750[0],local_740[0] + 1);
        }
        if (local_770 != local_760) {
          operator_delete(local_770,local_760[0] + 1);
        }
        if (local_628[0] != local_618) {
          operator_delete(local_628[0],local_618[0] + 1);
        }
        plVar45 = local_648;
        if (local_648 != plVar50) goto LAB_00af6607;
      }
      else {
LAB_00af3b9a:
        psVar52 = (package->
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        psVar30 = (package->
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        uVar46 = (long)psVar30 - (long)psVar52;
        pMVar40 = pMVar41;
        if (uVar46 < 0x11) {
LAB_00af4700:
          pWVar28 = (pointer)CONCAT44(uVar55,uVar53);
LAB_00af4807:
          if (pWVar28 != pWVar25) {
            pSVar16 = &pMVar40->m_subpackage;
            do {
              (pWVar28->m_package_feerate).nSatoshisPerK = package_feerate.nSatoshisPerK;
              bVar21 = PolicyScriptChecks(pMVar40,(ATMPArgs *)pWVar28,pWVar38);
              if (!bVar21) {
                pvVar15 = (void *)((long)&result.m_variant.
                                          super__Variant_base<bilingual_str,_std::monostate>.
                                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                          super__Copy_ctor_alias<bilingual_str,_std::monostate> +
                                  0x10);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[0] = (uchar)pvVar15;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                     (undefined7)((ulong)pvVar15 >> 8);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&result,"transaction failed","");
                _Var3._M_p = (pointer)((long)&err.
                                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                              .
                                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              ._M_payload + 0x10);
                err.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)_Var3._M_p;
                std::__cxx11::string::_M_construct<char_const*>((string *)&err,"");
                ValidationState<PackageValidationResult>::Invalid
                          (&package_state.super_ValidationState<PackageValidationResult>,PCKG_TX,
                           (string *)&result,(string *)&err);
                if (err.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._M_value._M_dataplus._M_p != (_Alloc_hider)_Var3._M_p) {
                  operator_delete((void *)err.
                                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ._M_payload._M_value._M_dataplus._M_p,
                                  err.
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload._16_8_ + 1);
                }
                if ((void *)CONCAT71(result.m_variant.
                                     super__Variant_base<bilingual_str,_std::monostate>.
                                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                     _M_u._1_7_,
                                     result.m_variant.
                                     super__Variant_base<bilingual_str,_std::monostate>.
                                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                     _M_u._M_first._M_storage._M_storage[0]) != pvVar15) {
                  operator_delete((void *)CONCAT71(result.m_variant.
                                                                                                      
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._1_7_,
                                                  result.m_variant.
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._M_first._M_storage._M_storage[0]),
                                  CONCAT71(result.m_variant.
                                           super__Variant_base<bilingual_str,_std::monostate>.
                                           super__Move_assign_alias<bilingual_str,_std::monostate>.
                                           super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                           super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                           super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                           super__Variant_storage_alias<bilingual_str,_std::monostate>
                                           ._M_u._17_7_,
                                           result.m_variant.
                                           super__Variant_base<bilingual_str,_std::monostate>.
                                           super__Move_assign_alias<bilingual_str,_std::monostate>.
                                           super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                           super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                           super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                           super__Variant_storage_alias<bilingual_str,_std::monostate>
                                           ._M_u._M_first._M_storage._M_storage[0x10]) + 1);
                }
                peVar6 = (pWVar28->m_ptx->
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                local_808._0_4_ =
                     (pWVar28->m_state).super_ValidationState<TxValidationResult>.m_mode;
                local_808._4_4_ =
                     (pWVar28->m_state).super_ValidationState<TxValidationResult>.m_result;
                pcVar7 = (pWVar28->m_state).super_ValidationState<TxValidationResult>.
                         m_reject_reason._M_dataplus._M_p;
                local_800[0] = local_7f0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_800,pcVar7,
                           pcVar7 + (pWVar28->m_state).super_ValidationState<TxValidationResult>.
                                    m_reject_reason._M_string_length);
                pcVar7 = (pWVar28->m_state).super_ValidationState<TxValidationResult>.
                         m_debug_message._M_dataplus._M_p;
                local_7e0[0] = local_7d0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_7e0,pcVar7,
                           pcVar7 + (pWVar28->m_state).super_ValidationState<TxValidationResult>.
                                    m_debug_message._M_string_length);
                state_08.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p.
                _0_4_ = uVar53;
                state_08.super_ValidationState<TxValidationResult>._0_8_ = pMVar40;
                state_08.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p.
                _4_4_ = uVar55;
                state_08.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length
                     = __n;
                state_08.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
                _M_allocated_capacity = (size_type)args_00;
                state_08.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
                _M_local_buf[8] = uVar57;
                state_08.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._9_7_ =
                     uVar58;
                state_08.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p
                     = (pointer)__return_storage_ptr__;
                state_08.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length.
                _0_4_ = (int)nFeePaid;
                state_08.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length.
                _4_4_ = (int)((ulong)nFeePaid >> 0x20);
                state_08.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
                _M_allocated_capacity = (size_type)in_stack_fffffffffffff650;
                state_08.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
                     in_stack_fffffffffffff658;
                MempoolAcceptResult::Failure((MempoolAcceptResult *)&result,state_08);
                std::
                _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                          ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                            *)&results,&peVar6->m_witness_hash,(MempoolAcceptResult *)&result);
                if (local_2e8 == true) {
                  local_2e8 = false;
                  pvVar15 = (void *)CONCAT71(local_300._1_7_,local_300._0_1_);
                  if (pvVar15 != (void *)0x0) {
                    operator_delete(pvVar15,(long)local_300._M_value.
                                                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)pvVar15);
                  }
                }
                std::__cxx11::
                _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            *)local_348);
                if ((__index_type *)
                    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._48_8_ !=
                    (__index_type *)
                    ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                            super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x40U)) {
                  operator_delete((void *)result.m_variant.
                                          super__Variant_base<bilingual_str,_std::monostate>.
                                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                          super__Variant_storage_alias<bilingual_str,_std::monostate>
                                          ._M_u._48_8_,
                                  result.m_variant.
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate>._64_8_
                                  + 1);
                }
                if ((void *)CONCAT71(result.m_variant.
                                     super__Variant_base<bilingual_str,_std::monostate>.
                                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                     _M_u._17_7_,
                                     result.m_variant.
                                     super__Variant_base<bilingual_str,_std::monostate>.
                                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                     _M_u._M_first._M_storage._M_storage[0x10]) !=
                    (void *)((long)&result.m_variant.
                                    super__Variant_base<bilingual_str,_std::monostate>.
                                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x20U))
                {
                  operator_delete((void *)CONCAT71(result.m_variant.
                                                                                                      
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._17_7_,
                                                  result.m_variant.
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._M_first._M_storage._M_storage[0x10]),
                                  result.m_variant.
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                  _32_8_ + 1);
                }
                if (local_7e0[0] != local_7d0) {
                  operator_delete(local_7e0[0],local_7d0[0] + 1);
                }
                if (local_800[0] != local_7f0) {
                  operator_delete(local_800[0],local_7f0[0] + 1);
                }
                local_850._0_4_ =
                     package_state.super_ValidationState<PackageValidationResult>.m_mode;
                local_850._4_4_ =
                     package_state.super_ValidationState<PackageValidationResult>.m_result;
                plVar50 = local_838;
                local_848 = plVar50;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_848,
                           package_state.super_ValidationState<PackageValidationResult>.
                           m_reject_reason._M_dataplus._M_p,
                           package_state.super_ValidationState<PackageValidationResult>.
                           m_reject_reason._M_dataplus._M_p +
                           package_state.super_ValidationState<PackageValidationResult>.
                           m_reject_reason._M_string_length);
                local_828[0] = local_818;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_828,
                           package_state.super_ValidationState<PackageValidationResult>.
                           m_debug_message._M_dataplus._M_p,
                           package_state.super_ValidationState<PackageValidationResult>.
                           m_debug_message._M_dataplus._M_p +
                           package_state.super_ValidationState<PackageValidationResult>.
                           m_debug_message._M_string_length);
                state_09.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
                _M_p._0_4_ = uVar53;
                state_09.super_ValidationState<PackageValidationResult>._0_8_ = pMVar40;
                state_09.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
                _M_p._4_4_ = uVar55;
                state_09.super_ValidationState<PackageValidationResult>.m_reject_reason.
                _M_string_length = __n;
                state_09.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
                _M_allocated_capacity = (size_type)args_00;
                state_09.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
                _M_local_buf[8] = uVar57;
                state_09.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
                _9_7_ = uVar58;
                state_09.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus.
                _M_p = (pointer)__return_storage_ptr__;
                state_09.super_ValidationState<PackageValidationResult>.m_debug_message.
                _M_string_length._0_4_ = (int)nFeePaid;
                state_09.super_ValidationState<PackageValidationResult>.m_debug_message.
                _M_string_length._4_4_ = (int)((ulong)nFeePaid >> 0x20);
                state_09.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
                _M_allocated_capacity = (size_type)in_stack_fffffffffffff650;
                state_09.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
                _8_8_ = in_stack_fffffffffffff658;
                PackageMempoolAcceptResult::PackageMempoolAcceptResult
                          (__return_storage_ptr__,state_09,
                           (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                            *)local_850);
                plVar45 = local_848;
                if (local_828[0] != local_818) {
                  operator_delete(local_828[0],local_818[0] + 1);
                  plVar45 = local_848;
                }
                goto LAB_00af65fa;
              }
              pWVar38 = extraout_RDX_05;
              if (args_00->m_test_accept == true) {
                if (args_00->m_package_feerates == true) {
                  __dnew_1 = (pWVar28->m_package_feerate).nSatoshisPerK;
                  bVar22 = 1;
                }
                else {
                  CFeeRate::CFeeRate((CFeeRate *)&__dnew_1,&pWVar28->m_modified_fees,
                                     (uint32_t)pWVar28->m_vsize);
                  bVar22 = args_00->m_package_feerates;
                }
                if ((bVar22 & 1) == 0) {
                  peVar6 = (pWVar28->m_ptx->
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr;
                  uVar32 = *(undefined8 *)
                            (peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                  ;
                  uVar11 = *(undefined8 *)
                            ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                                   _M_elems + 8);
                  uVar12 = *(undefined8 *)
                            ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                                   _M_elems + 0x10);
                  uVar13 = *(undefined8 *)
                            ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                                   _M_elems + 0x18);
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first.
                  _M_storage._M_storage[0x10] = (uchar)uVar12;
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                       (undefined7)((ulong)uVar12 >> 8);
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first.
                  _M_storage._M_storage[0x18] = (uchar)uVar13;
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                       (undefined7)((ulong)uVar13 >> 8);
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first.
                  _M_storage._M_storage[0] = (uchar)uVar32;
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                       (undefined7)((ulong)uVar32 >> 8);
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_4_ =
                       (undefined4)uVar11;
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                       (undefined4)((ulong)uVar11 >> 0x20);
                  __l_00._M_len = 1;
                  __l_00._M_array = (iterator)&result;
                  std::
                  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                  ::vector((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                            *)&err,__l_00,(allocator_type *)local_f0);
                }
                else {
                  std::
                  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                  ::vector((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                            *)&err,&all_package_wtxids);
                }
                peVar6 = (pWVar28->m_ptx->
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                limits = (char *)pWVar28->m_base_fees;
                MempoolAcceptResult::MempoolAcceptResult
                          ((MempoolAcceptResult *)&result,&pSVar16->m_replaced_transactions,
                           pWVar28->m_vsize,(CAmount)limits,(CFeeRate)__dnew_1,
                           (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                            *)&err);
                std::
                _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                          ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                            *)&results,&peVar6->m_witness_hash,(MempoolAcceptResult *)&result);
                if (local_2e8 == true) {
                  local_2e8 = false;
                  pvVar15 = (void *)CONCAT71(local_300._1_7_,local_300._0_1_);
                  if (pvVar15 != (void *)0x0) {
                    operator_delete(pvVar15,(long)local_300._M_value.
                                                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)pvVar15);
                  }
                }
                std::__cxx11::
                _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            *)local_348);
                pWVar38 = extraout_RDX_06;
                if ((__index_type *)
                    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._48_8_ !=
                    (__index_type *)
                    ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                            super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x40U)) {
                  operator_delete((void *)result.m_variant.
                                          super__Variant_base<bilingual_str,_std::monostate>.
                                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                          super__Variant_storage_alias<bilingual_str,_std::monostate>
                                          ._M_u._48_8_,
                                  result.m_variant.
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate>._64_8_
                                  + 1);
                  pWVar38 = extraout_RDX_07;
                }
                if ((void *)CONCAT71(result.m_variant.
                                     super__Variant_base<bilingual_str,_std::monostate>.
                                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                     _M_u._17_7_,
                                     result.m_variant.
                                     super__Variant_base<bilingual_str,_std::monostate>.
                                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                     _M_u._M_first._M_storage._M_storage[0x10]) !=
                    (void *)((long)&result.m_variant.
                                    super__Variant_base<bilingual_str,_std::monostate>.
                                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x20U))
                {
                  operator_delete((void *)CONCAT71(result.m_variant.
                                                                                                      
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._17_7_,
                                                  result.m_variant.
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._M_first._M_storage._M_storage[0x10]),
                                  result.m_variant.
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                  _32_8_ + 1);
                  pWVar38 = extraout_RDX_08;
                }
                if (err.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._M_value._M_dataplus._M_p != (pointer)0x0) {
                  operator_delete((void *)err.
                                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ._M_payload._M_value._M_dataplus._M_p,
                                  err.
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload._16_8_ -
                                  err.
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload._0_8_);
                  pWVar38 = extraout_RDX_09;
                }
              }
              pWVar28 = pWVar28 + 1;
            } while (pWVar28 != pWVar25);
          }
          if (args_00->m_test_accept == true) {
            local_898._0_4_ = package_state.super_ValidationState<PackageValidationResult>.m_mode;
            local_898._4_4_ = package_state.super_ValidationState<PackageValidationResult>.m_result;
            plVar50 = local_880;
            local_890 = plVar50;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_890,
                       package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                       _M_dataplus._M_p,
                       package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                       _M_dataplus._M_p +
                       package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                       _M_string_length);
            local_870[0] = local_860;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_870,
                       package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                       _M_dataplus._M_p,
                       package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                       _M_dataplus._M_p +
                       package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                       _M_string_length);
            state_07.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p
            ._0_4_ = uVar53;
            state_07.super_ValidationState<PackageValidationResult>._0_8_ = pMVar40;
            state_07.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p
            ._4_4_ = uVar55;
            state_07.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length
                 = __n;
            state_07.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
            _M_allocated_capacity = (size_type)args_00;
            state_07.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
            _M_local_buf[8] = uVar57;
            state_07.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._9_7_ =
                 uVar58;
            state_07.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p
                 = (pointer)__return_storage_ptr__;
            state_07.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length
            ._0_4_ = (int)nFeePaid;
            state_07.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length
            ._4_4_ = (int)((ulong)nFeePaid >> 0x20);
            state_07.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
            _M_allocated_capacity = (size_type)in_stack_fffffffffffff650;
            state_07.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
                 in_stack_fffffffffffff658;
            PackageMempoolAcceptResult::PackageMempoolAcceptResult
                      (__return_storage_ptr__,state_07,
                       (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                        *)local_898);
            plVar45 = local_890;
            if (local_870[0] != local_860) {
              operator_delete(local_870[0],local_860[0] + 1);
              plVar45 = local_890;
            }
          }
          else {
            lVar37 = (long)local_968.
                           super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_968.
                           super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            lVar47 = (lVar37 >> 6) * -0x71c71c71c71c71c7 >> 2;
            uVar53 = SUB84(local_968.
                           super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                           ._M_impl.super__Vector_impl_data._M_finish,0);
            uVar55 = (undefined4)
                     ((ulong)local_968.
                             super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                             ._M_impl.super__Vector_impl_data._M_finish >> 0x20);
            pWVar25 = local_968.
                      super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pWVar28 = local_968.
                      super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pMVar41 = pMVar40;
            pWVar31 = local_968.
                      super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar29 = result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_;
            if (0 < lVar47) {
              lVar47 = lVar47 + 1;
              pWVar25 = local_968.
                        super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                        ._M_impl.super__Vector_impl_data._M_start + 2;
              do {
                pWVar28 = pWVar25;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._36_4_ =
                     (undefined4)((ulong)lVar29 >> 0x20);
                peVar6 = ((pWVar28[-2].m_ptx)->
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[0] = '\0';
                uVar32 = *(undefined8 *)
                          (peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
                uVar11 = *(undefined8 *)
                          ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8)
                ;
                uVar12 = *(undefined8 *)
                          ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0x10);
                uVar13 = *(undefined8 *)
                          ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0x18);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                     (undefined7)uVar12;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[0x18] = (uchar)((ulong)uVar12 >> 0x38);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                     (undefined7)uVar13;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._33_3_ =
                     (undefined3)((ulong)lVar29 >> 8);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[0x20] = (uchar)((ulong)uVar13 >> 0x38);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                     (undefined7)uVar32;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[8] = (uchar)((ulong)uVar32 >> 0x38);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._9_3_ =
                     (undefined3)uVar11;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                     (undefined4)((ulong)uVar11 >> 0x18);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[0x10] = (uchar)((ulong)uVar11 >> 0x38);
                bVar21 = CTxMemPool::exists(pMVar40->m_pool,(GenTxid *)&result);
                uVar32 = CONCAT71(extraout_var,bVar21);
                if (bVar21) {
                  pWVar28 = pWVar28 + -2;
                  pWVar38 = extraout_RDX_10;
LAB_00af4fe3:
                  pWVar25 = (pointer)CONCAT44(uVar55,uVar53);
                  pWVar49 = pWVar31;
                  pAVar56 = args_00;
                  goto LAB_00af4ff2;
                }
                peVar6 = ((pWVar28[-1].m_ptx)->
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[0] = '\0';
                uVar32 = *(undefined8 *)
                          (peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
                uVar11 = *(undefined8 *)
                          ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8)
                ;
                uVar12 = *(undefined8 *)
                          ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0x10);
                uVar13 = *(undefined8 *)
                          ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0x18);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                     (undefined7)uVar12;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[0x18] = (uchar)((ulong)uVar12 >> 0x38);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                     (undefined7)uVar13;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[0x20] = (uchar)((ulong)uVar13 >> 0x38);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                     (undefined7)uVar32;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[8] = (uchar)((ulong)uVar32 >> 0x38);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._9_3_ =
                     (undefined3)uVar11;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                     (undefined4)((ulong)uVar11 >> 0x18);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[0x10] = (uchar)((ulong)uVar11 >> 0x38);
                bVar21 = CTxMemPool::exists(pMVar40->m_pool,(GenTxid *)&result);
                uVar32 = CONCAT71(extraout_var_00,bVar21);
                if (bVar21) {
                  pWVar28 = pWVar28 + -1;
                  pWVar38 = extraout_RDX_11;
                  goto LAB_00af4fe3;
                }
                peVar6 = (pWVar28->m_ptx->
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[0] = '\0';
                uVar32 = *(undefined8 *)
                          (peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
                uVar11 = *(undefined8 *)
                          ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8)
                ;
                uVar12 = *(undefined8 *)
                          ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0x10);
                uVar13 = *(undefined8 *)
                          ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0x18);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                     (undefined7)uVar12;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[0x18] = (uchar)((ulong)uVar12 >> 0x38);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                     (undefined7)uVar13;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[0x20] = (uchar)((ulong)uVar13 >> 0x38);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                     (undefined7)uVar32;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[8] = (uchar)((ulong)uVar32 >> 0x38);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._9_3_ =
                     (undefined3)uVar11;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                     (undefined4)((ulong)uVar11 >> 0x18);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[0x10] = (uchar)((ulong)uVar11 >> 0x38);
                bVar21 = CTxMemPool::exists(pMVar40->m_pool,(GenTxid *)&result);
                uVar32 = CONCAT71(extraout_var_01,bVar21);
                pWVar38 = extraout_RDX_12;
                if (bVar21) goto LAB_00af4fe3;
                peVar6 = ((pWVar28[1].m_ptx)->
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[0] = '\0';
                uVar32 = *(undefined8 *)
                          (peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
                uVar11 = *(undefined8 *)
                          ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8)
                ;
                uVar12 = *(undefined8 *)
                          ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0x10);
                uVar13 = *(undefined8 *)
                          ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0x18);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                     (undefined7)uVar12;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[0x18] = (uchar)((ulong)uVar12 >> 0x38);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                     (undefined7)uVar13;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[0x20] = (uchar)((ulong)uVar13 >> 0x38);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                     (undefined7)uVar32;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[8] = (uchar)((ulong)uVar32 >> 0x38);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._9_3_ =
                     (undefined3)uVar11;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                     (undefined4)((ulong)uVar11 >> 0x18);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[0x10] = (uchar)((ulong)uVar11 >> 0x38);
                bVar21 = CTxMemPool::exists(pMVar40->m_pool,(GenTxid *)&result);
                lVar29 = CONCAT44(result.m_variant.
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                  _36_4_,result.m_variant.
                                         super__Variant_base<bilingual_str,_std::monostate>.
                                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                         super__Variant_storage_alias<bilingual_str,_std::monostate>
                                         ._M_u._32_4_);
                uVar32 = CONCAT71(extraout_var_02,bVar21);
                pWVar38 = extraout_RDX_13;
                if (bVar21) {
                  pWVar28 = pWVar28 + 1;
                  goto LAB_00af4fe3;
                }
                lVar47 = lVar47 + -1;
                lVar37 = lVar37 + -0x900;
                pWVar25 = pWVar28 + 4;
              } while (1 < lVar47);
              pWVar25 = (pointer)CONCAT44(uVar55,uVar53);
              pWVar28 = pWVar28 + 2;
            }
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._36_4_ =
                 (undefined4)((ulong)lVar29 >> 0x20);
            uVar60 = (undefined4)((ulong)nFeePaid >> 0x20);
            uVar32 = 0x8e38e38e38e38e39;
            lVar37 = (lVar37 >> 6) * -0x71c71c71c71c71c7;
            pWVar49 = pWVar31;
            pAVar56 = args_00;
            if (lVar37 == 1) {
LAB_00af4fa3:
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._36_4_ =
                   (undefined4)((ulong)lVar29 >> 0x20);
              ppCVar17 = &pMVar40->m_pool;
              peVar6 = (pWVar28->m_ptx->
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0] = '\0';
              uVar32 = *(undefined8 *)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
              ;
              uVar11 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
              uVar12 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10
                        );
              uVar13 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18
                        );
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                   (undefined7)uVar32;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[8] = (uchar)((ulong)uVar32 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._9_3_ =
                   (undefined3)uVar11;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                   (undefined4)((ulong)uVar11 >> 0x18);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x10] = (uchar)((ulong)uVar11 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                   (undefined7)uVar12;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x18] = (uchar)((ulong)uVar12 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                   (undefined7)uVar13;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._33_3_ =
                   (undefined3)((ulong)lVar29 >> 8);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x20] = (uchar)((ulong)uVar13 >> 0x38);
              pMVar40 = pMVar41;
              bVar21 = CTxMemPool::exists(*ppCVar17,(GenTxid *)&result);
              uVar32 = CONCAT71(extraout_var_05,bVar21);
              pWVar38 = extraout_RDX_16;
              pMVar41 = pMVar40;
              if (!bVar21) {
                pWVar28 = pWVar25;
              }
LAB_00af4ff2:
              uVar60 = (undefined4)((ulong)nFeePaid >> 0x20);
              lVar29 = CONCAT44(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                _36_4_,result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._32_4_);
              if (pWVar28 != pWVar25) {
                __assert_fail("std::all_of(workspaces.cbegin(), workspaces.cend(), [this](const auto& ws){ return !m_pool.exists(GenTxid::Txid(ws.m_ptx->GetHash())); })"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                              ,0x547,
                              "bool (anonymous namespace)::MemPoolAccept::SubmitPackage(const ATMPArgs &, std::vector<Workspace> &, PackageValidationState &, std::map<uint256, MempoolAcceptResult> &)"
                             );
              }
            }
            else {
              if (lVar37 == 2) {
LAB_00af4f60:
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._36_4_ =
                     (undefined4)((ulong)lVar29 >> 0x20);
                ppCVar17 = &pMVar40->m_pool;
                peVar6 = (pWVar28->m_ptx->
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[0] = '\0';
                uVar32 = *(undefined8 *)
                          (peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
                uVar11 = *(undefined8 *)
                          ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8)
                ;
                uVar12 = *(undefined8 *)
                          ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0x10);
                uVar13 = *(undefined8 *)
                          ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0x18);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                     (undefined7)uVar32;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[8] = (uchar)((ulong)uVar32 >> 0x38);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._9_3_ =
                     (undefined3)uVar11;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                     (undefined4)((ulong)uVar11 >> 0x18);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[0x10] = (uchar)((ulong)uVar11 >> 0x38);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                     (undefined7)uVar12;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[0x18] = (uchar)((ulong)uVar12 >> 0x38);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                     (undefined7)uVar13;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._33_3_ =
                     (undefined3)((ulong)lVar29 >> 8);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[0x20] = (uchar)((ulong)uVar13 >> 0x38);
                pMVar40 = pMVar41;
                bVar21 = CTxMemPool::exists(*ppCVar17,(GenTxid *)&result);
                lVar29 = CONCAT44(result.m_variant.
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                  _36_4_,result.m_variant.
                                         super__Variant_base<bilingual_str,_std::monostate>.
                                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                         super__Variant_storage_alias<bilingual_str,_std::monostate>
                                         ._M_u._32_4_);
                uVar32 = CONCAT71(extraout_var_04,bVar21);
                pWVar38 = extraout_RDX_15;
                pMVar41 = pMVar40;
                if (!bVar21) {
                  pWVar28 = pWVar28 + 1;
                  goto LAB_00af4fa3;
                }
                goto LAB_00af4ff2;
              }
              if (lVar37 == 3) {
                ppCVar17 = &pMVar40->m_pool;
                peVar6 = (pWVar28->m_ptx->
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[0] = '\0';
                uVar32 = *(undefined8 *)
                          (peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
                uVar11 = *(undefined8 *)
                          ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8)
                ;
                uVar12 = *(undefined8 *)
                          ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0x10);
                uVar13 = *(undefined8 *)
                          ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0x18);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                     (undefined7)uVar32;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[8] = (uchar)((ulong)uVar32 >> 0x38);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._9_3_ =
                     (undefined3)uVar11;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                     (undefined4)((ulong)uVar11 >> 0x18);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[0x10] = (uchar)((ulong)uVar11 >> 0x38);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                     (undefined7)uVar12;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[0x18] = (uchar)((ulong)uVar12 >> 0x38);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                     (undefined7)uVar13;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._33_3_ =
                     (undefined3)((ulong)lVar29 >> 8);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[0x20] = (uchar)((ulong)uVar13 >> 0x38);
                pMVar40 = pMVar41;
                bVar21 = CTxMemPool::exists(*ppCVar17,(GenTxid *)&result);
                lVar29 = CONCAT44(result.m_variant.
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                  _36_4_,result.m_variant.
                                         super__Variant_base<bilingual_str,_std::monostate>.
                                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                         super__Variant_storage_alias<bilingual_str,_std::monostate>
                                         ._M_u._32_4_);
                uVar32 = CONCAT71(extraout_var_03,bVar21);
                pWVar38 = extraout_RDX_14;
                pMVar41 = pMVar40;
                if (!bVar21) {
                  pWVar28 = pWVar28 + 1;
                  goto LAB_00af4f60;
                }
                goto LAB_00af4ff2;
              }
            }
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ = lVar29;
            uVar59 = (uint)CONCAT71((int7)((ulong)uVar32 >> 8),1);
            pWVar28 = pWVar31;
            pWVar48 = pWVar31;
            if (pWVar31 != pWVar25) {
              args_00 = pAVar56;
              do {
                bVar21 = ConsensusScriptChecks(pMVar40,(ATMPArgs *)pWVar31,pWVar38);
                if (!bVar21) {
                  peVar6 = (pWVar31->m_ptx->
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr;
                  err.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload._M_value._M_dataplus._M_p =
                       (_Alloc_hider)
                       *(undefined8 *)&(pWVar31->m_state).super_ValidationState<TxValidationResult>;
                  err.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload._M_value._M_string_length =
                       (long)&err.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload + 0x18;
                  pcVar7 = (pWVar31->m_state).super_ValidationState<TxValidationResult>.
                           m_reject_reason._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)
                             ((long)&err.
                                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                     ._M_payload.
                                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                     .
                                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     ._M_payload + 8),pcVar7,
                             pcVar7 + (pWVar31->m_state).super_ValidationState<TxValidationResult>.
                                      m_reject_reason._M_string_length);
                  local_708 = (string  [8])(local_700._M_local_buf + 8);
                  pcVar7 = (pWVar31->m_state).super_ValidationState<TxValidationResult>.
                           m_debug_message._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            (local_708,pcVar7,
                             pcVar7 + (pWVar31->m_state).super_ValidationState<TxValidationResult>.
                                      m_debug_message._M_string_length);
                  state_10.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
                  _M_p._0_4_ = uVar53;
                  state_10.super_ValidationState<TxValidationResult>._0_8_ = pMVar41;
                  state_10.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
                  _M_p._4_4_ = uVar55;
                  state_10.super_ValidationState<TxValidationResult>.m_reject_reason.
                  _M_string_length = (size_type)pWVar49;
                  state_10.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
                  _M_allocated_capacity = (size_type)args_00;
                  state_10.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
                  _M_local_buf[8] = uVar57;
                  state_10.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._9_7_ =
                       uVar58;
                  state_10.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus.
                  _M_p = (pointer)__return_storage_ptr__;
                  state_10.super_ValidationState<TxValidationResult>.m_debug_message.
                  _M_string_length._0_4_ = uVar59;
                  state_10.super_ValidationState<TxValidationResult>.m_debug_message.
                  _M_string_length._4_4_ = uVar60;
                  state_10.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
                  _M_allocated_capacity = (size_type)in_stack_fffffffffffff650;
                  state_10.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
                       in_stack_fffffffffffff658;
                  MempoolAcceptResult::Failure((MempoolAcceptResult *)&result,state_10);
                  std::
                  _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                  ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                            ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                              *)&results,&peVar6->m_witness_hash,(MempoolAcceptResult *)&result);
                  if (local_2e8 == true) {
                    local_2e8 = false;
                    pvVar15 = (void *)CONCAT71(local_300._1_7_,local_300._0_1_);
                    if (pvVar15 != (void *)0x0) {
                      operator_delete(pvVar15,(long)local_300._M_value.
                                                                                                        
                                                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)pvVar15);
                    }
                  }
                  std::__cxx11::
                  _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                              *)local_348);
                  if ((__index_type *)
                      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._48_8_ !=
                      (__index_type *)
                      ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x40U)) {
                    operator_delete((void *)result.m_variant.
                                            super__Variant_base<bilingual_str,_std::monostate>.
                                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                            super__Variant_storage_alias<bilingual_str,_std::monostate>
                                            ._M_u._48_8_,
                                    result.m_variant.
                                    super__Variant_base<bilingual_str,_std::monostate>.
                                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                    _64_8_ + 1);
                  }
                  if ((void *)CONCAT71(result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._17_7_,
                                       result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._M_first._M_storage._M_storage[0x10]) !=
                      (void *)((long)&result.m_variant.
                                      super__Variant_base<bilingual_str,_std::monostate>.
                                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                      super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x20U)
                     ) {
                    operator_delete((void *)CONCAT71(result.m_variant.
                                                                                                          
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._17_7_,
                                                  result.m_variant.
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._M_first._M_storage._M_storage[0x10]),
                                    result.m_variant.
                                    super__Variant_base<bilingual_str,_std::monostate>.
                                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u
                                    ._32_8_ + 1);
                  }
                  if (local_708 != (string  [8])(local_700._M_local_buf + 8)) {
                    operator_delete((void *)local_708,local_700._8_8_ + 1);
                  }
                  if ((undefined1 *)
                      err.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._M_value._M_string_length !=
                      (undefined1 *)
                      ((long)&err.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload + 0x18)) {
                    operator_delete((void *)err.
                                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                            .
                                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            ._M_payload._M_value._M_string_length,
                                    err.
                                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ._M_payload._24_8_ + 1);
                  }
                  base_blob<256u>::ToString_abi_cxx11_
                            ((string *)&__dnew_1,
                             &((pWVar31->m_ptx->
                               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->hash);
                  tinyformat::format<std::__cxx11::string>
                            ((string *)&result,
                             (tinyformat *)
                             "BUG! PolicyScriptChecks succeeded but ConsensusScriptChecks failed: %s"
                             ,(char *)&__dnew_1,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             limits);
                  pptVar4 = &effective_feerate_wtxids_1.
                             super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  effective_feerate_wtxids_1.
                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  effective_feerate_wtxids_1.
                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                  effective_feerate_wtxids_1.
                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)pptVar4;
                  ValidationState<PackageValidationResult>::Invalid
                            (&package_state.super_ValidationState<PackageValidationResult>,
                             PCKG_MEMPOOL_ERROR,(string *)&result,
                             (string *)&effective_feerate_wtxids_1);
                  if (effective_feerate_wtxids_1.
                      super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)pptVar4) {
                    operator_delete(effective_feerate_wtxids_1.
                                    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    CONCAT71(effective_feerate_wtxids_1.
                                             super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                             _1_7_,effective_feerate_wtxids_1.
                                                                                                      
                                                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._0_1_) + 1);
                  }
                  if ((void *)CONCAT71(result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._1_7_,
                                       result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._M_first._M_storage._M_storage[0]) !=
                      (void *)((long)&result.m_variant.
                                      super__Variant_base<bilingual_str,_std::monostate>.
                                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                      super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x10U)
                     ) {
                    operator_delete((void *)CONCAT71(result.m_variant.
                                                                                                          
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._1_7_,
                                                  result.m_variant.
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._M_first._M_storage._M_storage[0]),
                                    CONCAT71(result.m_variant.
                                             super__Variant_base<bilingual_str,_std::monostate>.
                                             super__Move_assign_alias<bilingual_str,_std::monostate>
                                             .
                                             super__Copy_assign_alias<bilingual_str,_std::monostate>
                                             .super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                             super__Variant_storage_alias<bilingual_str,_std::monostate>
                                             ._M_u._17_7_,
                                             result.m_variant.
                                             super__Variant_base<bilingual_str,_std::monostate>.
                                             super__Move_assign_alias<bilingual_str,_std::monostate>
                                             .
                                             super__Copy_assign_alias<bilingual_str,_std::monostate>
                                             .super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                             super__Variant_storage_alias<bilingual_str,_std::monostate>
                                             ._M_u._M_first._M_storage._M_storage[0x10]) + 1);
                  }
                  if ((undefined1 *)__dnew_1 != auStack_a0 + 8) {
                    operator_delete((void *)__dnew_1,(ulong)(auStack_a0._8_8_ + 1));
                  }
                  uVar59 = 0;
                }
                limits = (char *)&(pMVar40->m_pool->m_opts).limits;
                CTxMemPool::CalculateMemPoolAncestors
                          ((Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                            *)&__dnew_1,pMVar40->m_pool,
                           (pWVar31->m_entry)._M_t.
                           super___uniq_ptr_impl<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_CTxMemPoolEntry_*,_std::default_delete<CTxMemPoolEntry>_>
                           .super__Head_base<0UL,_CTxMemPoolEntry_*,_false>._M_head_impl,
                           (Limits *)limits,true);
                if (local_68 != '\x01') {
                  peVar6 = (pWVar31->m_ptx->
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr;
                  local_f0 = *(undefined1 (*) [8])
                              &(pWVar31->m_state).super_ValidationState<TxValidationResult>;
                  local_e8 = local_e0._M_local_buf + 8;
                  pcVar7 = (pWVar31->m_state).super_ValidationState<TxValidationResult>.
                           m_reject_reason._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_e8,pcVar7,
                             pcVar7 + (pWVar31->m_state).super_ValidationState<TxValidationResult>.
                                      m_reject_reason._M_string_length);
                  local_c8[0] = local_b8;
                  pcVar7 = (pWVar31->m_state).super_ValidationState<TxValidationResult>.
                           m_debug_message._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_c8,pcVar7,
                             pcVar7 + (pWVar31->m_state).super_ValidationState<TxValidationResult>.
                                      m_debug_message._M_string_length);
                  state_11.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
                  _M_p._0_4_ = uVar53;
                  state_11.super_ValidationState<TxValidationResult>._0_8_ = pMVar41;
                  state_11.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
                  _M_p._4_4_ = uVar55;
                  state_11.super_ValidationState<TxValidationResult>.m_reject_reason.
                  _M_string_length = (size_type)pWVar49;
                  state_11.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
                  _M_allocated_capacity = (size_type)args_00;
                  state_11.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
                  _M_local_buf[8] = uVar57;
                  state_11.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._9_7_ =
                       uVar58;
                  state_11.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus.
                  _M_p = (pointer)__return_storage_ptr__;
                  state_11.super_ValidationState<TxValidationResult>.m_debug_message.
                  _M_string_length._0_4_ = uVar59;
                  state_11.super_ValidationState<TxValidationResult>.m_debug_message.
                  _M_string_length._4_4_ = uVar60;
                  state_11.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
                  _M_allocated_capacity = (size_type)in_stack_fffffffffffff650;
                  state_11.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
                       in_stack_fffffffffffff658;
                  MempoolAcceptResult::Failure((MempoolAcceptResult *)&result,state_11);
                  std::
                  _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                  ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                            ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                              *)&results,&peVar6->m_witness_hash,(MempoolAcceptResult *)&result);
                  if (local_2e8 == true) {
                    local_2e8 = false;
                    pvVar15 = (void *)CONCAT71(local_300._1_7_,local_300._0_1_);
                    if (pvVar15 != (void *)0x0) {
                      operator_delete(pvVar15,(long)local_300._M_value.
                                                                                                        
                                                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)pvVar15);
                    }
                  }
                  std::__cxx11::
                  _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                              *)local_348);
                  if ((__index_type *)
                      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._48_8_ !=
                      (__index_type *)
                      ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x40U)) {
                    operator_delete((void *)result.m_variant.
                                            super__Variant_base<bilingual_str,_std::monostate>.
                                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                            super__Variant_storage_alias<bilingual_str,_std::monostate>
                                            ._M_u._48_8_,
                                    result.m_variant.
                                    super__Variant_base<bilingual_str,_std::monostate>.
                                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                    _64_8_ + 1);
                  }
                  if ((void *)CONCAT71(result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._17_7_,
                                       result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._M_first._M_storage._M_storage[0x10]) !=
                      (void *)((long)&result.m_variant.
                                      super__Variant_base<bilingual_str,_std::monostate>.
                                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                      super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x20U)
                     ) {
                    operator_delete((void *)CONCAT71(result.m_variant.
                                                                                                          
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._17_7_,
                                                  result.m_variant.
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._M_first._M_storage._M_storage[0x10]),
                                    result.m_variant.
                                    super__Variant_base<bilingual_str,_std::monostate>.
                                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u
                                    ._32_8_ + 1);
                  }
                  if (local_c8[0] != local_b8) {
                    operator_delete(local_c8[0],local_b8[0] + 1);
                  }
                  if (local_e8 != local_e0._M_local_buf + 8) {
                    operator_delete(local_e8,local_e0._8_8_ + 1);
                  }
                  base_blob<256u>::ToString_abi_cxx11_
                            ((string *)&effective_feerate_wtxids_1,
                             &((pWVar31->m_ptx->
                               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->hash);
                  tinyformat::format<std::__cxx11::string>
                            ((string *)&result,
                             (tinyformat *)
                             "BUG! Mempool ancestors or descendants were underestimated: %s",
                             (char *)&effective_feerate_wtxids_1,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             limits);
                  local_100._M_local_buf[0] = '\0';
                  limits = (char *)&parent_feerate;
                  parent_feerate.nSatoshisPerK = (CAmount)&local_100;
                  ValidationState<PackageValidationResult>::Invalid
                            (&package_state.super_ValidationState<PackageValidationResult>,
                             PCKG_MEMPOOL_ERROR,(string *)&result,(string *)limits);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)parent_feerate.nSatoshisPerK != &local_100) {
                    operator_delete((void *)parent_feerate.nSatoshisPerK,
                                    CONCAT71(local_100._M_allocated_capacity._1_7_,
                                             local_100._M_local_buf[0]) + 1);
                  }
                  if ((void *)CONCAT71(result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._1_7_,
                                       result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._M_first._M_storage._M_storage[0]) !=
                      (void *)((long)&result.m_variant.
                                      super__Variant_base<bilingual_str,_std::monostate>.
                                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                      super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x10U)
                     ) {
                    operator_delete((void *)CONCAT71(result.m_variant.
                                                                                                          
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._1_7_,
                                                  result.m_variant.
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._M_first._M_storage._M_storage[0]),
                                    CONCAT71(result.m_variant.
                                             super__Variant_base<bilingual_str,_std::monostate>.
                                             super__Move_assign_alias<bilingual_str,_std::monostate>
                                             .
                                             super__Copy_assign_alias<bilingual_str,_std::monostate>
                                             .super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                             super__Variant_storage_alias<bilingual_str,_std::monostate>
                                             ._M_u._17_7_,
                                             result.m_variant.
                                             super__Variant_base<bilingual_str,_std::monostate>.
                                             super__Move_assign_alias<bilingual_str,_std::monostate>
                                             .
                                             super__Copy_assign_alias<bilingual_str,_std::monostate>
                                             .super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                             super__Variant_storage_alias<bilingual_str,_std::monostate>
                                             ._M_u._M_first._M_storage._M_storage[0x10]) + 1);
                  }
                  if (effective_feerate_wtxids_1.
                      super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                      (pointer)&effective_feerate_wtxids_1.
                                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    operator_delete(effective_feerate_wtxids_1.
                                    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    CONCAT71(effective_feerate_wtxids_1.
                                             super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                             _1_7_,effective_feerate_wtxids_1.
                                                                                                      
                                                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._0_1_) + 1);
                  }
                  uVar59 = 0;
                }
                util::
                Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,CompareIteratorByHash,std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>>
                ::
                value_or<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,CompareIteratorByHash,std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>&>
                          ((T *)&result,
                           (_Variant_storage<false,_bilingual_str,_std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                            *)&__dnew_1,&pWVar31->m_ancestors);
                std::_Rb_tree<$270907ca$>::clear(&(pWVar31->m_ancestors)._M_t);
                p_Var34 = (_Base_ptr)
                          CONCAT71(result.m_variant.
                                   super__Variant_base<bilingual_str,_std::monostate>.
                                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                   super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                   _17_7_,result.m_variant.
                                          super__Variant_base<bilingual_str,_std::monostate>.
                                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                          super__Variant_storage_alias<bilingual_str,_std::monostate>
                                          ._M_u._M_first._M_storage._M_storage[0x10]);
                if (p_Var34 != (_Base_ptr)0x0) {
                  (pWVar31->m_ancestors)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                       result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_4_;
                  (pWVar31->m_ancestors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                       p_Var34;
                  (pWVar31->m_ancestors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                       (_Base_ptr)
                       CONCAT71(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                _25_7_,result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._M_first._M_storage._M_storage[0x18]);
                  (pWVar31->m_ancestors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                       (_Base_ptr)
                       result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_;
                  p_Var34->_M_parent =
                       &(pWVar31->m_ancestors)._M_t._M_impl.super__Rb_tree_header._M_header;
                  (pWVar31->m_ancestors)._M_t._M_impl.super__Rb_tree_header._M_node_count =
                       result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._40_8_;
                  limits = (char *)0x0;
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first.
                  _M_storage._M_storage[0x10] = '\0';
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ = 0;
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ =
                       (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate> + 8;
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first.
                  _M_storage._M_storage[0x18] =
                       (uchar)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                              _32_8_;
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                       (undefined7)
                       ((ulong)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                               super__Move_assign_alias<bilingual_str,_std::monostate>.
                               super__Copy_assign_alias<bilingual_str,_std::monostate>.
                               super__Move_ctor_alias<bilingual_str,_std::monostate>.
                               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                               super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                               _32_8_ >> 8);
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._40_8_ = 0;
                }
                std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&result);
                std::__detail::__variant::
                _Variant_storage<false,_bilingual_str,_std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                                     *)&__dnew_1);
                bVar21 = Finalize(pMVar40,args_00,pWVar31);
                pWVar38 = extraout_RDX_17;
                if (!bVar21) {
                  peVar6 = (pWVar31->m_ptx->
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr;
                  local_158 = *(undefined1 (*) [8])
                               &(pWVar31->m_state).super_ValidationState<TxValidationResult>;
                  local_150 = local_148._M_local_buf + 8;
                  pcVar7 = (pWVar31->m_state).super_ValidationState<TxValidationResult>.
                           m_reject_reason._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_150,pcVar7,
                             pcVar7 + (pWVar31->m_state).super_ValidationState<TxValidationResult>.
                                      m_reject_reason._M_string_length);
                  local_130[0] = local_120;
                  pcVar7 = (pWVar31->m_state).super_ValidationState<TxValidationResult>.
                           m_debug_message._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_130,pcVar7,
                             pcVar7 + (pWVar31->m_state).super_ValidationState<TxValidationResult>.
                                      m_debug_message._M_string_length);
                  state_12.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
                  _M_p._0_4_ = uVar53;
                  state_12.super_ValidationState<TxValidationResult>._0_8_ = pMVar41;
                  state_12.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
                  _M_p._4_4_ = uVar55;
                  state_12.super_ValidationState<TxValidationResult>.m_reject_reason.
                  _M_string_length = (size_type)pWVar49;
                  state_12.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
                  _M_allocated_capacity = (size_type)args_00;
                  state_12.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
                  _M_local_buf[8] = uVar57;
                  state_12.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._9_7_ =
                       uVar58;
                  state_12.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus.
                  _M_p = (pointer)__return_storage_ptr__;
                  state_12.super_ValidationState<TxValidationResult>.m_debug_message.
                  _M_string_length._0_4_ = uVar59;
                  state_12.super_ValidationState<TxValidationResult>.m_debug_message.
                  _M_string_length._4_4_ = uVar60;
                  state_12.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
                  _M_allocated_capacity = (size_type)in_stack_fffffffffffff650;
                  state_12.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
                       in_stack_fffffffffffff658;
                  MempoolAcceptResult::Failure((MempoolAcceptResult *)&result,state_12);
                  std::
                  _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                  ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                            ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                              *)&results,&peVar6->m_witness_hash,(MempoolAcceptResult *)&result);
                  if (local_2e8 == true) {
                    local_2e8 = false;
                    pvVar15 = (void *)CONCAT71(local_300._1_7_,local_300._0_1_);
                    if (pvVar15 != (void *)0x0) {
                      operator_delete(pvVar15,(long)local_300._M_value.
                                                                                                        
                                                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)pvVar15);
                    }
                  }
                  std::__cxx11::
                  _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                              *)local_348);
                  if ((__index_type *)
                      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._48_8_ !=
                      (__index_type *)
                      ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x40U)) {
                    operator_delete((void *)result.m_variant.
                                            super__Variant_base<bilingual_str,_std::monostate>.
                                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                            super__Variant_storage_alias<bilingual_str,_std::monostate>
                                            ._M_u._48_8_,
                                    result.m_variant.
                                    super__Variant_base<bilingual_str,_std::monostate>.
                                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                    _64_8_ + 1);
                  }
                  if ((void *)CONCAT71(result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._17_7_,
                                       result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._M_first._M_storage._M_storage[0x10]) !=
                      (void *)((long)&result.m_variant.
                                      super__Variant_base<bilingual_str,_std::monostate>.
                                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                      super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x20U)
                     ) {
                    operator_delete((void *)CONCAT71(result.m_variant.
                                                                                                          
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._17_7_,
                                                  result.m_variant.
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._M_first._M_storage._M_storage[0x10]),
                                    result.m_variant.
                                    super__Variant_base<bilingual_str,_std::monostate>.
                                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u
                                    ._32_8_ + 1);
                  }
                  if (local_130[0] != local_120) {
                    operator_delete(local_130[0],local_120[0] + 1);
                  }
                  if (local_150 != local_148._M_local_buf + 8) {
                    operator_delete(local_150,local_148._8_8_ + 1);
                  }
                  base_blob<256u>::ToString_abi_cxx11_
                            ((string *)&__dnew_1,
                             &((pWVar31->m_ptx->
                               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->hash);
                  tinyformat::format<std::__cxx11::string>
                            ((string *)&result,(tinyformat *)"BUG! Adding to mempool failed: %s",
                             (char *)&__dnew_1,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             limits);
                  pptVar4 = &effective_feerate_wtxids_1.
                             super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  effective_feerate_wtxids_1.
                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  effective_feerate_wtxids_1.
                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                  limits = (char *)&effective_feerate_wtxids_1;
                  effective_feerate_wtxids_1.
                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)pptVar4;
                  ValidationState<PackageValidationResult>::Invalid
                            (&package_state.super_ValidationState<PackageValidationResult>,
                             PCKG_MEMPOOL_ERROR,(string *)&result,(string *)limits);
                  pWVar38 = extraout_RDX_18;
                  if (effective_feerate_wtxids_1.
                      super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)pptVar4) {
                    operator_delete(effective_feerate_wtxids_1.
                                    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    CONCAT71(effective_feerate_wtxids_1.
                                             super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                             _1_7_,effective_feerate_wtxids_1.
                                                                                                      
                                                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._0_1_) + 1);
                    pWVar38 = extraout_RDX_19;
                  }
                  if ((void *)CONCAT71(result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._1_7_,
                                       result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._M_first._M_storage._M_storage[0]) !=
                      (void *)((long)&result.m_variant.
                                      super__Variant_base<bilingual_str,_std::monostate>.
                                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                      super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x10U)
                     ) {
                    operator_delete((void *)CONCAT71(result.m_variant.
                                                                                                          
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._1_7_,
                                                  result.m_variant.
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._M_first._M_storage._M_storage[0]),
                                    CONCAT71(result.m_variant.
                                             super__Variant_base<bilingual_str,_std::monostate>.
                                             super__Move_assign_alias<bilingual_str,_std::monostate>
                                             .
                                             super__Copy_assign_alias<bilingual_str,_std::monostate>
                                             .super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                             super__Variant_storage_alias<bilingual_str,_std::monostate>
                                             ._M_u._17_7_,
                                             result.m_variant.
                                             super__Variant_base<bilingual_str,_std::monostate>.
                                             super__Move_assign_alias<bilingual_str,_std::monostate>
                                             .
                                             super__Copy_assign_alias<bilingual_str,_std::monostate>
                                             .super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                             super__Variant_storage_alias<bilingual_str,_std::monostate>
                                             ._M_u._M_first._M_storage._M_storage[0x10]) + 1);
                    pWVar38 = extraout_RDX_20;
                  }
                  if ((undefined1 *)__dnew_1 != auStack_a0 + 8) {
                    operator_delete((void *)__dnew_1,(ulong)(auStack_a0._8_8_ + 1));
                    pWVar38 = extraout_RDX_21;
                  }
                  uVar59 = 0;
                }
                pWVar31 = pWVar31 + 1;
                pWVar28 = local_968.
                          super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pWVar48 = local_968.
                          super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                pAVar56 = args_00;
              } while (pWVar31 != (Workspace *)CONCAT44(uVar55,uVar53));
            }
            uVar54 = (uint)pWVar28;
            uVar53 = (undefined4)((ulong)pWVar28 >> 0x20);
            __dnew_1 = 0;
            auStack_a0._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            auStack_a0._8_8_ = (_Base_ptr)0x0;
            __n_00 = (pointer)(((long)pWVar48 - (long)pWVar28 >> 6) * -0x71c71c71c71c71c7);
            std::
            vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
            reserve((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                     *)&__dnew_1,(size_type)__n_00);
            if ((pointer)CONCAT44(uVar53,uVar54) != pWVar48) {
              pWVar25 = (pointer)CONCAT44(uVar53,uVar54);
              do {
                peVar6 = (pWVar25->m_ptx->
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                uVar32 = *(undefined8 *)
                          (peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
                uVar11 = *(undefined8 *)
                          ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                                 _M_elems + 8);
                uVar12 = *(undefined8 *)
                          ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                                 _M_elems + 0x10);
                uVar13 = *(undefined8 *)
                          ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                                 _M_elems + 0x18);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[0x10] = (uchar)uVar12;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                     (undefined7)((ulong)uVar12 >> 8);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[0x18] = (uchar)uVar13;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                     (undefined7)((ulong)uVar13 >> 8);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[0] = (uchar)uVar32;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                     (undefined7)((ulong)uVar32 >> 8);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_4_ =
                     (undefined4)uVar11;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                     (undefined4)((ulong)uVar11 >> 0x20);
                if (auStack_a0._0_8_ == auStack_a0._8_8_) {
                  std::
                  vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>
                  ::_M_realloc_insert<transaction_identifier<true>>
                            ((vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>
                              *)&__dnew_1,(iterator)auStack_a0._0_8_,
                             (transaction_identifier<true> *)&result);
                }
                else {
                  uVar32 = *(undefined8 *)
                            (peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                  ;
                  uVar11 = *(undefined8 *)
                            ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                                   _M_elems + 8);
                  uVar12 = *(undefined8 *)
                            ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                                   _M_elems + 0x18);
                  *(undefined8 *)(auStack_a0._0_8_ + 0x10) =
                       *(undefined8 *)
                        ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                               _M_elems + 0x10);
                  *(undefined8 *)(auStack_a0._0_8_ + 0x18) = uVar12;
                  *(undefined8 *)auStack_a0._0_8_ = uVar32;
                  *(undefined8 *)(auStack_a0._0_8_ + 8) = uVar11;
                  auStack_a0._0_8_ = auStack_a0._0_8_ + 0x20;
                }
                pWVar25 = pWVar25 + 1;
              } while (pWVar25 != pWVar48);
            }
            replaced_txns = &(pMVar41->m_subpackage).m_replaced_transactions;
            pMVar40 = pMVar41;
            if ((pMVar41->m_subpackage).m_replaced_transactions.
                super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)replaced_txns)
            {
              pLVar35 = LogInstance();
              bVar21 = BCLog::Logger::WillLogCategoryLevel(pLVar35,MEMPOOL,Debug);
              if (bVar21) {
                sVar8 = (pMVar41->m_subpackage).m_replaced_transactions.
                        super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        ._M_impl._M_node._M_size;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[0] = (uchar)sVar8;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                     (undefined7)(sVar8 >> 8);
                parent_feerate.nSatoshisPerK =
                     (pMVar41->m_subpackage).m_total_modified_fees -
                     (pMVar41->m_subpackage).m_conflicting_fees;
                package_feerate_1.nSatoshisPerK =
                     (pMVar41->m_subpackage).m_total_vsize -
                     (long)(int)(pMVar41->m_subpackage).m_conflicting_size;
                source_file._M_str =
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                ;
                source_file._M_len = 0x5e;
                logging_function._M_str = "SubmitPackage";
                logging_function._M_len = 0xd;
                pMVar41 = pMVar40;
                effective_feerate_wtxids_1.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_start = __n_00;
                LogPrintFormatInternal<unsigned_long,unsigned_long,long,long>
                          (logging_function,source_file,0x580,MEMPOOL,Debug,
                           (ConstevalFormatString<4U>)0xfb56aa,(unsigned_long *)&result,
                           (unsigned_long *)&effective_feerate_wtxids_1,
                           &parent_feerate.nSatoshisPerK,&package_feerate_1.nSatoshisPerK);
                pMVar40 = pMVar41;
              }
            }
            pWVar25 = (pointer)CONCAT44(uVar53,uVar54);
            if (pWVar25 != pWVar48) {
              do {
                if (args_00->m_package_feerates == true) {
                  parent_feerate.nSatoshisPerK = (pWVar25->m_package_feerate).nSatoshisPerK;
                  bVar22 = 1;
                }
                else {
                  CFeeRate::CFeeRate(&parent_feerate,&pWVar25->m_modified_fees,
                                     (uint32_t)pWVar25->m_vsize);
                  bVar22 = args_00->m_package_feerates;
                }
                if ((bVar22 & 1) == 0) {
                  peVar6 = (pWVar25->m_ptx->
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr;
                  uVar32 = *(undefined8 *)
                            (peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                  ;
                  uVar11 = *(undefined8 *)
                            ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                                   _M_elems + 8);
                  uVar12 = *(undefined8 *)
                            ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                                   _M_elems + 0x10);
                  uVar13 = *(undefined8 *)
                            ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                                   _M_elems + 0x18);
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first.
                  _M_storage._M_storage[0x10] = (uchar)uVar12;
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                       (undefined7)((ulong)uVar12 >> 8);
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first.
                  _M_storage._M_storage[0x18] = (uchar)uVar13;
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                       (undefined7)((ulong)uVar13 >> 8);
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first.
                  _M_storage._M_storage[0] = (uchar)uVar32;
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                       (undefined7)((ulong)uVar32 >> 8);
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_4_ =
                       (undefined4)uVar11;
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                       (undefined4)((ulong)uVar11 >> 0x20);
                  __l_01._M_len = 1;
                  __l_01._M_array = (iterator)&result;
                  std::
                  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                  ::vector(&effective_feerate_wtxids_1,__l_01,(allocator_type *)&package_feerate_1);
                }
                else {
                  std::
                  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                  ::vector(&effective_feerate_wtxids_1,
                           (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                            *)&__dnew_1);
                }
                peVar6 = (pWVar25->m_ptx->
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                MempoolAcceptResult::MempoolAcceptResult
                          ((MempoolAcceptResult *)&result,replaced_txns,pWVar25->m_vsize,
                           pWVar25->m_base_fees,parent_feerate,&effective_feerate_wtxids_1);
                std::
                _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                          ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                            *)&results,&peVar6->m_witness_hash,(MempoolAcceptResult *)&result);
                if (local_2e8 == true) {
                  local_2e8 = false;
                  pvVar15 = (void *)CONCAT71(local_300._1_7_,local_300._0_1_);
                  if (pvVar15 != (void *)0x0) {
                    operator_delete(pvVar15,(long)local_300._M_value.
                                                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)pvVar15);
                  }
                }
                std::__cxx11::
                _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            *)local_348);
                if ((__index_type *)
                    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._48_8_ !=
                    (__index_type *)
                    ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                            super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x40U)) {
                  operator_delete((void *)result.m_variant.
                                          super__Variant_base<bilingual_str,_std::monostate>.
                                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                          super__Variant_storage_alias<bilingual_str,_std::monostate>
                                          ._M_u._48_8_,
                                  result.m_variant.
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate>._64_8_
                                  + 1);
                }
                if ((void *)CONCAT71(result.m_variant.
                                     super__Variant_base<bilingual_str,_std::monostate>.
                                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                     _M_u._17_7_,
                                     result.m_variant.
                                     super__Variant_base<bilingual_str,_std::monostate>.
                                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                     _M_u._M_first._M_storage._M_storage[0x10]) !=
                    (void *)((long)&result.m_variant.
                                    super__Variant_base<bilingual_str,_std::monostate>.
                                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x20U))
                {
                  operator_delete((void *)CONCAT71(result.m_variant.
                                                                                                      
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._17_7_,
                                                  result.m_variant.
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._M_first._M_storage._M_storage[0x10]),
                                  result.m_variant.
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                  _32_8_ + 1);
                }
                if ((pMVar41->m_pool->m_opts).signals != (ValidationSignals *)0x0) {
                  pCVar51 = pWVar25->m_ptx;
                  tx = (pCVar51->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr;
                  pMVar40 = (MemPoolAccept *)pWVar25->m_vsize;
                  uVar54 = ((pWVar25->m_entry)._M_t.
                            super___uniq_ptr_impl<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_CTxMemPoolEntry_*,_std::default_delete<CTxMemPoolEntry>_>
                            .super__Head_base<0UL,_CTxMemPoolEntry_*,_false>._M_head_impl)->
                           entryHeight;
                  uVar57 = args_00->m_bypass_limits;
                  bVar21 = args_00->m_package_submission;
                  bVar23 = IsCurrentForFeeEstimation(pMVar41->m_active_chainstate);
                  bVar24 = CTxMemPool::HasNoInputsOf(pMVar41->m_pool,tx);
                  uVar32 = result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                           super__Move_assign_alias<bilingual_str,_std::monostate>.
                           super__Copy_assign_alias<bilingual_str,_std::monostate>.
                           super__Move_ctor_alias<bilingual_str,_std::monostate>.
                           super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                           super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._40_8_;
                  peVar6 = (pCVar51->
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr;
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first.
                  _M_storage._M_storage[0] = (uchar)peVar6;
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                       (undefined7)((ulong)peVar6 >> 8);
                  p_Var9 = (pCVar51->
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                           _M_refcount._M_pi;
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_4_ =
                       SUB84(p_Var9,0);
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                       (undefined4)((ulong)p_Var9 >> 0x20);
                  if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
                    }
                  }
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first.
                  _M_storage._M_storage[0x10] = (uchar)pWVar25->m_base_fees;
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                       (undefined7)((ulong)pWVar25->m_base_fees >> 8);
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first.
                  _M_storage._M_storage[0x18] = (uchar)pMVar40;
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                       (undefined7)((ulong)pMVar40 >> 8);
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first.
                  _M_storage._M_storage[0x29] = bVar21;
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first.
                  _M_storage._M_storage[0x28] = uVar57;
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first.
                  _M_storage._M_storage[0x2a] = bVar23;
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._44_4_ =
                       SUB84(uVar32,4);
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first.
                  _M_storage._M_storage[0x2b] = bVar24;
                  pCVar10 = pMVar41->m_pool;
                  mempool_sequence = pCVar10->m_sequence_number;
                  this_00 = (pCVar10->m_opts).signals;
                  pCVar10->m_sequence_number = mempool_sequence + 1;
                  args_00 = pAVar56;
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_4_ = uVar54;
                  ValidationSignals::TransactionAddedToMempool
                            (this_00,(NewMempoolTransactionInfo *)&result,mempool_sequence);
                  pAVar56 = args_00;
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      CONCAT44(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                               super__Move_assign_alias<bilingual_str,_std::monostate>.
                               super__Copy_assign_alias<bilingual_str,_std::monostate>.
                               super__Move_ctor_alias<bilingual_str,_std::monostate>.
                               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                               super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                               _12_4_,result.m_variant.
                                      super__Variant_base<bilingual_str,_std::monostate>.
                                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                      super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                      _M_u._8_4_) !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               CONCAT44(result.m_variant.
                                        super__Variant_base<bilingual_str,_std::monostate>.
                                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                        super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                        _M_u._12_4_,
                                        result.m_variant.
                                        super__Variant_base<bilingual_str,_std::monostate>.
                                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                        super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                        _M_u._8_4_));
                  }
                }
                if (effective_feerate_wtxids_1.
                    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(effective_feerate_wtxids_1.
                                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  CONCAT71(effective_feerate_wtxids_1.
                                           super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                           effective_feerate_wtxids_1.
                                           super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_)
                                  - (long)effective_feerate_wtxids_1.
                                          super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                }
                pWVar25 = pWVar25 + 1;
              } while (pWVar25 != pWVar48);
            }
            if (__dnew_1 != 0) {
              operator_delete((void *)__dnew_1,auStack_a0._8_8_ - __dnew_1);
            }
            if ((uVar59 & 1) == 0) {
              local_8e0._0_4_ = package_state.super_ValidationState<PackageValidationResult>.m_mode;
              local_8e0._4_4_ =
                   package_state.super_ValidationState<PackageValidationResult>.m_result;
              plVar50 = local_8c8;
              local_8d8 = plVar50;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_8d8,
                         package_state.super_ValidationState<PackageValidationResult>.
                         m_reject_reason._M_dataplus._M_p,
                         package_state.super_ValidationState<PackageValidationResult>.
                         m_reject_reason._M_dataplus._M_p +
                         package_state.super_ValidationState<PackageValidationResult>.
                         m_reject_reason._M_string_length);
              local_8b8[0] = local_8a8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_8b8,
                         package_state.super_ValidationState<PackageValidationResult>.
                         m_debug_message._M_dataplus._M_p,
                         package_state.super_ValidationState<PackageValidationResult>.
                         m_debug_message._M_dataplus._M_p +
                         package_state.super_ValidationState<PackageValidationResult>.
                         m_debug_message._M_string_length);
              state_14.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
              _M_p._0_4_ = uVar54;
              state_14.super_ValidationState<PackageValidationResult>._0_8_ = pMVar40;
              state_14.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
              _M_p._4_4_ = uVar53;
              state_14.super_ValidationState<PackageValidationResult>.m_reject_reason.
              _M_string_length = (size_type)pWVar48;
              state_14.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
              _M_allocated_capacity = (size_type)pAVar56;
              state_14.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
              _M_local_buf[8] = uVar57;
              state_14.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._9_7_
                   = uVar58;
              state_14.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus.
              _M_p = (pointer)__return_storage_ptr__;
              state_14.super_ValidationState<PackageValidationResult>.m_debug_message.
              _M_string_length._0_4_ = uVar59;
              state_14.super_ValidationState<PackageValidationResult>.m_debug_message.
              _M_string_length._4_4_ = uVar60;
              state_14.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
              _M_allocated_capacity = (size_type)in_stack_fffffffffffff650;
              state_14.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_
                   = in_stack_fffffffffffff658;
              PackageMempoolAcceptResult::PackageMempoolAcceptResult
                        (__return_storage_ptr__,state_14,
                         (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                          *)local_8e0);
              plVar45 = local_8d8;
              if (local_8b8[0] != local_8a8) {
                operator_delete(local_8b8[0],local_8a8[0] + 1);
                plVar45 = local_8d8;
              }
            }
            else {
              local_928._0_4_ = package_state.super_ValidationState<PackageValidationResult>.m_mode;
              local_928._4_4_ =
                   package_state.super_ValidationState<PackageValidationResult>.m_result;
              plVar50 = local_910;
              local_920 = plVar50;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_920,
                         package_state.super_ValidationState<PackageValidationResult>.
                         m_reject_reason._M_dataplus._M_p,
                         package_state.super_ValidationState<PackageValidationResult>.
                         m_reject_reason._M_dataplus._M_p +
                         package_state.super_ValidationState<PackageValidationResult>.
                         m_reject_reason._M_string_length);
              local_900[0] = local_8f0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_900,
                         package_state.super_ValidationState<PackageValidationResult>.
                         m_debug_message._M_dataplus._M_p,
                         package_state.super_ValidationState<PackageValidationResult>.
                         m_debug_message._M_dataplus._M_p +
                         package_state.super_ValidationState<PackageValidationResult>.
                         m_debug_message._M_string_length);
              state_13.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
              _M_p._0_4_ = uVar54;
              state_13.super_ValidationState<PackageValidationResult>._0_8_ = pMVar40;
              state_13.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
              _M_p._4_4_ = uVar53;
              state_13.super_ValidationState<PackageValidationResult>.m_reject_reason.
              _M_string_length = (size_type)pWVar48;
              state_13.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
              _M_allocated_capacity = (size_type)pAVar56;
              state_13.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
              _M_local_buf[8] = uVar57;
              state_13.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._9_7_
                   = uVar58;
              state_13.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus.
              _M_p = (pointer)__return_storage_ptr__;
              state_13.super_ValidationState<PackageValidationResult>.m_debug_message.
              _M_string_length._0_4_ = uVar59;
              state_13.super_ValidationState<PackageValidationResult>.m_debug_message.
              _M_string_length._4_4_ = uVar60;
              state_13.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
              _M_allocated_capacity = (size_type)in_stack_fffffffffffff650;
              state_13.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_
                   = in_stack_fffffffffffff658;
              PackageMempoolAcceptResult::PackageMempoolAcceptResult
                        (__return_storage_ptr__,state_13,
                         (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                          *)local_928);
              plVar45 = local_920;
              if (local_900[0] != local_8f0) {
                operator_delete(local_900[0],local_8f0[0] + 1);
                plVar45 = local_920;
              }
            }
          }
        }
        else {
          limits = (char *)*piVar42;
          uVar43 = (long)uVar46 >> 6;
          lVar37 = result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                   super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_;
          if (0 < (long)uVar43) {
            uVar43 = uVar43 + 1;
            psVar20 = psVar52 + 2;
            do {
              psVar52 = psVar20;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._36_4_ =
                   (undefined4)((ulong)lVar37 >> 0x20);
              peVar6 = psVar52[-2].
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0] = '\0';
              uVar32 = *(undefined8 *)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
              ;
              uVar11 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
              uVar12 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10
                        );
              uVar13 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18
                        );
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                   (undefined7)uVar12;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x18] = (uchar)((ulong)uVar12 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                   (undefined7)uVar13;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._33_3_ =
                   (undefined3)((ulong)lVar37 >> 8);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x20] = (uchar)((ulong)uVar13 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                   (undefined7)uVar32;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[8] = (uchar)((ulong)uVar32 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._9_3_ =
                   (undefined3)uVar11;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                   (undefined4)((ulong)uVar11 >> 0x18);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x10] = (uchar)((ulong)uVar11 >> 0x38);
              bVar21 = CTxMemPool::exists(pMVar41->m_pool,(GenTxid *)&result);
              if (bVar21) {
                psVar52 = psVar52 + -2;
LAB_00af44d9:
                package = (Package *)CONCAT71(uVar58,uVar57);
                in_stack_fffffffffffff650 = psVar30;
                in_stack_fffffffffffff658 = (string *)limits;
                goto LAB_00af44e8;
              }
              peVar6 = psVar52[-1].
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0] = '\0';
              uVar32 = *(undefined8 *)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
              ;
              uVar11 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
              uVar12 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10
                        );
              uVar13 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18
                        );
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                   (undefined7)uVar12;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x18] = (uchar)((ulong)uVar12 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                   (undefined7)uVar13;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x20] = (uchar)((ulong)uVar13 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                   (undefined7)uVar32;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[8] = (uchar)((ulong)uVar32 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._9_3_ =
                   (undefined3)uVar11;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                   (undefined4)((ulong)uVar11 >> 0x18);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x10] = (uchar)((ulong)uVar11 >> 0x38);
              bVar21 = CTxMemPool::exists(pMVar41->m_pool,(GenTxid *)&result);
              if (bVar21) {
                psVar52 = psVar52 + -1;
                goto LAB_00af44d9;
              }
              peVar6 = (psVar52->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0] = '\0';
              uVar32 = *(undefined8 *)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
              ;
              uVar11 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
              uVar12 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10
                        );
              uVar13 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18
                        );
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                   (undefined7)uVar12;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x18] = (uchar)((ulong)uVar12 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                   (undefined7)uVar13;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x20] = (uchar)((ulong)uVar13 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                   (undefined7)uVar32;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[8] = (uchar)((ulong)uVar32 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._9_3_ =
                   (undefined3)uVar11;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                   (undefined4)((ulong)uVar11 >> 0x18);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x10] = (uchar)((ulong)uVar11 >> 0x38);
              bVar21 = CTxMemPool::exists(pMVar41->m_pool,(GenTxid *)&result);
              if (bVar21) goto LAB_00af44d9;
              peVar6 = psVar52[1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0] = '\0';
              uVar32 = *(undefined8 *)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
              ;
              uVar11 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
              uVar12 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10
                        );
              uVar13 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18
                        );
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                   (undefined7)uVar12;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x18] = (uchar)((ulong)uVar12 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                   (undefined7)uVar13;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x20] = (uchar)((ulong)uVar13 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                   (undefined7)uVar32;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[8] = (uchar)((ulong)uVar32 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._9_3_ =
                   (undefined3)uVar11;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                   (undefined4)((ulong)uVar11 >> 0x18);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x10] = (uchar)((ulong)uVar11 >> 0x38);
              bVar21 = CTxMemPool::exists(pMVar41->m_pool,(GenTxid *)&result);
              lVar37 = CONCAT44(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                _36_4_,result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._32_4_);
              if (bVar21) {
                psVar52 = psVar52 + 1;
                goto LAB_00af44d9;
              }
              uVar43 = uVar43 - 1;
              uVar46 = uVar46 - 0x40;
              psVar20 = psVar52 + 4;
            } while (1 < (long)uVar43);
            psVar52 = psVar52 + 2;
            package = (Package *)CONCAT71(uVar58,uVar57);
            in_stack_fffffffffffff650 = psVar30;
            in_stack_fffffffffffff658 = (string *)limits;
          }
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._36_4_ =
               (undefined4)((ulong)lVar37 >> 0x20);
          lVar47 = (long)uVar46 >> 4;
          if (lVar47 == 1) {
LAB_00af44a3:
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._36_4_ =
                 (undefined4)((ulong)lVar37 >> 0x20);
            peVar6 = (psVar52->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
            _M_storage[0] = '\0';
            uVar32 = *(undefined8 *)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
            uVar11 = *(undefined8 *)
                      ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
            uVar12 = *(undefined8 *)
                      ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
            uVar13 = *(undefined8 *)
                      ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                 (undefined7)uVar32;
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
            _M_storage[8] = (uchar)((ulong)uVar32 >> 0x38);
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._9_3_ =
                 (undefined3)uVar11;
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                 (undefined4)((ulong)uVar11 >> 0x18);
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
            _M_storage[0x10] = (uchar)((ulong)uVar11 >> 0x38);
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                 (undefined7)uVar12;
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
            _M_storage[0x18] = (uchar)((ulong)uVar12 >> 0x38);
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                 (undefined7)uVar13;
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._33_3_ =
                 (undefined3)((ulong)lVar37 >> 8);
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
            _M_storage[0x20] = (uchar)((ulong)uVar13 >> 0x38);
            bVar21 = CTxMemPool::exists(pMVar41->m_pool,(GenTxid *)&result);
            if (!bVar21) {
              psVar52 = psVar30;
            }
LAB_00af44e8:
            lVar37 = CONCAT44(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                              _36_4_,result.m_variant.
                                     super__Variant_base<bilingual_str,_std::monostate>.
                                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                     _M_u._32_4_);
            if (psVar52 != psVar30) {
              __assert_fail("std::all_of(txns.cbegin(), txns.cend(), [this](const auto& tx) { return !m_pool.exists(GenTxid::Txid(tx->GetHash()));})"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                            ,0x475,
                            "bool (anonymous namespace)::MemPoolAccept::PackageMempoolChecks(const std::vector<CTransactionRef> &, std::vector<Workspace> &, const int64_t, PackageValidationState &)"
                           );
            }
          }
          else {
            if (lVar47 == 2) {
LAB_00af446c:
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._36_4_ =
                   (undefined4)((ulong)lVar37 >> 0x20);
              peVar6 = (psVar52->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0] = '\0';
              uVar32 = *(undefined8 *)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
              ;
              uVar11 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
              uVar12 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10
                        );
              uVar13 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18
                        );
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                   (undefined7)uVar32;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[8] = (uchar)((ulong)uVar32 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._9_3_ =
                   (undefined3)uVar11;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                   (undefined4)((ulong)uVar11 >> 0x18);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x10] = (uchar)((ulong)uVar11 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                   (undefined7)uVar12;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x18] = (uchar)((ulong)uVar12 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                   (undefined7)uVar13;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._33_3_ =
                   (undefined3)((ulong)lVar37 >> 8);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x20] = (uchar)((ulong)uVar13 >> 0x38);
              bVar21 = CTxMemPool::exists(pMVar41->m_pool,(GenTxid *)&result);
              lVar37 = CONCAT44(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                _36_4_,result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._32_4_);
              if (!bVar21) {
                psVar52 = psVar52 + 1;
                goto LAB_00af44a3;
              }
              goto LAB_00af44e8;
            }
            if (lVar47 == 3) {
              peVar6 = (psVar52->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0] = '\0';
              uVar32 = *(undefined8 *)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
              ;
              uVar11 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
              uVar12 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10
                        );
              uVar13 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18
                        );
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                   (undefined7)uVar32;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[8] = (uchar)((ulong)uVar32 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._9_3_ =
                   (undefined3)uVar11;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                   (undefined4)((ulong)uVar11 >> 0x18);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x10] = (uchar)((ulong)uVar11 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                   (undefined7)uVar12;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x18] = (uchar)((ulong)uVar12 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                   (undefined7)uVar13;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._33_3_ =
                   (undefined3)((ulong)lVar37 >> 8);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x20] = (uchar)((ulong)uVar13 >> 0x38);
              bVar21 = CTxMemPool::exists(pMVar41->m_pool,(GenTxid *)&result);
              lVar37 = CONCAT44(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                _36_4_,result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._32_4_);
              if (!bVar21) {
                psVar52 = psVar52 + 1;
                goto LAB_00af446c;
              }
              goto LAB_00af44e8;
            }
          }
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ = lVar37;
          if ((long)(package->
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(package->
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4 != __n) {
            __assert_fail("txns.size() == workspaces.size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                          ,0x477,
                          "bool (anonymous namespace)::MemPoolAccept::PackageMempoolChecks(const std::vector<CTransactionRef> &, std::vector<Workspace> &, const int64_t, PackageValidationState &)"
                         );
          }
          CTxMemPool::CheckPackageLimits(&result,pMVar41->m_pool,package,(int64_t)limits);
          if (result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_index == '\x01') {
            if ((pMVar41->m_subpackage).m_rbf == false) {
              std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
              ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)&result);
              pWVar38 = extraout_RDX_03;
              pMVar40 = pMVar41;
              goto LAB_00af4700;
            }
            pWVar28 = (pointer)CONCAT44(uVar55,uVar53);
            pMVar40 = pMVar41;
            if (lVar29 != 0x480) {
LAB_00af470d:
              _Var3._M_p = (pointer)((long)&err.
                                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                            .
                                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            ._M_payload + 0x10);
              __dnew_1 = 0x34;
              err.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)_Var3._M_p;
              err.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_dataplus._M_p =
                   (_Alloc_hider)
                   std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &err,&__dnew_1,0);
              err.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._16_8_ = __dnew_1;
              builtin_strncpy((char *)err.
                                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ._M_payload._M_value._M_dataplus._M_p,
                              "package RBF failed: package must be 1-parent-1-child",0x34);
              err.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_string_length = __dnew_1;
              *(char *)((long)err.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload._M_value._M_dataplus._M_p + __dnew_1) = '\0';
              auStack_a0._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              auStack_a0._8_8_ = auStack_a0._8_8_ & 0xffffffffffffff00;
              limits = (char *)&__dnew_1;
              __dnew_1 = (size_type)(auStack_a0 + 8);
              bVar21 = ValidationState<PackageValidationResult>::Invalid
                                 (&package_state.super_ValidationState<PackageValidationResult>,
                                  PCKG_POLICY,(string *)&err,(string *)limits);
              if ((undefined1 *)__dnew_1 != auStack_a0 + 8) {
                operator_delete((void *)__dnew_1,(ulong)(auStack_a0._8_8_ + 1));
              }
              if (err.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload._M_value._M_dataplus._M_p != (_Alloc_hider)_Var3._M_p) {
                operator_delete((void *)err.
                                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                        ._M_payload.
                                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                        .
                                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ._M_payload._M_value._M_dataplus._M_p,
                                err.
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._M_payload._16_8_ + 1);
              }
LAB_00af47e9:
              std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
              ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)&result);
              pWVar38 = extraout_RDX_04;
              goto LAB_00af47f9;
            }
            bVar21 = IsChildWithParents(package);
            if (!bVar21) goto LAB_00af470d;
            pWVar31 = pWVar28;
            if (pWVar28 == pWVar25) {
              err.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._24_8_ =
                   (long)&err.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload + 8;
              err.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_string_length =
                   (ulong)(uint)err.
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._M_payload._M_value._M_string_length._4_4_ << 0x20;
              err.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._16_8_ = 0;
              local_708 = (string  [8])0x0;
              err.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._32_8_ = err.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._24_8_;
            }
            else {
              do {
                if ((pWVar31->m_ancestors)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
                  _Var3._M_p = (pointer)((long)&err.
                                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                                ._M_payload.
                                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                                .
                                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                ._M_payload + 0x10);
                  err.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)_Var3._M_p;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&err,
                             "package RBF failed: new transaction cannot have mempool ancestors","")
                  ;
                  auStack_a0._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  auStack_a0._8_8_ = auStack_a0._8_8_ & 0xffffffffffffff00;
                  limits = (char *)&__dnew_1;
                  __dnew_1 = (size_type)(auStack_a0 + 8);
                  bVar21 = ValidationState<PackageValidationResult>::Invalid
                                     (&package_state.super_ValidationState<PackageValidationResult>,
                                      PCKG_POLICY,(string *)&err,(string *)limits);
                  if ((undefined1 *)__dnew_1 != auStack_a0 + 8) {
                    operator_delete((void *)__dnew_1,(ulong)(auStack_a0._8_8_ + 1));
                  }
                  if (err.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._M_value._M_dataplus._M_p != (_Alloc_hider)_Var3._M_p) {
                    operator_delete((void *)err.
                                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                            .
                                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            ._M_payload._M_value._M_dataplus._M_p,
                                    err.
                                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ._M_payload._16_8_ + 1);
                  }
                  goto LAB_00af47e9;
                }
                pWVar31 = pWVar31 + 1;
              } while (pWVar31 != pWVar25);
              err.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._24_8_ =
                   (long)&err.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload + 8;
              err.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_string_length =
                   (ulong)(uint)err.
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._M_payload._M_value._M_string_length._4_4_ << 0x20;
              err.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._16_8_ = 0;
              local_708 = (string  [8])0x0;
              pMVar41 = pMVar40;
              err.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._32_8_ = err.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._24_8_;
              do {
                std::_Rb_tree<$270907ca$>::_M_merge_unique<CompareIteratorByHash>
                          ((_Rb_tree<_270907ca_> *)&err,&(pWVar28->m_iters_conflicting)._M_t);
                pWVar28 = pWVar28 + 1;
                pWVar31 = local_968.
                          super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pMVar40 = pMVar41;
              } while (pWVar28 != pWVar25);
            }
            uVar53 = SUB84(pWVar31,0);
            uVar55 = (undefined4)((ulong)pWVar31 >> 0x20);
            all_conflicts = (string *)&(pMVar41->m_subpackage).m_all_conflicts;
            limits = (char *)&err;
            GetEntriesForConflicts_abi_cxx11_
                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&__dnew_1,
                       ((pWVar31[1].m_ptx)->
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                       pMVar41->m_pool,(setEntries *)limits,(setEntries *)all_conflicts);
            uVar18 = local_90[0]._M_local_buf[8];
            if (local_90[0]._M_local_buf[8] == 1) {
              local_f0 = (undefined1  [8])&local_e0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_f0,"package RBF failed: too many potential replacements",""
                        );
              limits = (char *)&__dnew_1;
              bVar21 = ValidationState<PackageValidationResult>::Invalid
                                 (&package_state.super_ValidationState<PackageValidationResult>,
                                  PCKG_POLICY,(string *)local_f0,(string *)limits);
              uVar43 = (ulong)bVar21;
              if (local_f0 != (undefined1  [8])&local_e0) {
                operator_delete((void *)local_f0,local_e0._M_allocated_capacity + 1);
              }
            }
            if (((local_90[0]._M_local_buf[8] & 1) != 0) &&
               (local_90[0]._M_local_buf[8] = 0, (undefined1 *)__dnew_1 != auStack_a0 + 8)) {
              operator_delete((void *)__dnew_1,(ulong)(auStack_a0._8_8_ + 1));
            }
            if (uVar18 == 0) {
              p_Var34 = (pMVar40->m_subpackage).m_all_conflicts._M_t._M_impl.super__Rb_tree_header.
                        _M_header._M_left;
              pMVar41 = pMVar40;
              while ((_Rb_tree_header *)p_Var34 !=
                     &(pMVar40->m_subpackage).m_all_conflicts._M_t._M_impl.super__Rb_tree_header) {
                lVar29 = *(long *)(p_Var34 + 1);
                pCVar1 = &(pMVar40->m_subpackage).m_conflicting_fees;
                *pCVar1 = *pCVar1 + *(long *)(lVar29 + 0xa8);
                iVar33 = GetVirtualTransactionSize
                                   ((long)*(int *)(lVar29 + 0x78),*(int64_t *)(lVar29 + 0xa0),
                                    nBytesPerSigOp);
                psVar2 = &(pMVar40->m_subpackage).m_conflicting_size;
                *psVar2 = *psVar2 + (long)(int)iVar33;
                p_Var34 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var34);
              }
              limits = (char *)(pMVar40->m_subpackage).m_total_vsize;
              relay_fee.nSatoshisPerK =
                   (pMVar40->m_pool->m_opts).incremental_relay_feerate.nSatoshisPerK;
              PaysForRBF_abi_cxx11_
                        ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&__dnew_1,(pMVar40->m_subpackage).m_conflicting_fees,
                         (pMVar40->m_subpackage).m_total_modified_fees,(size_t)limits,relay_fee,
                         (uint256 *)(**(long **)(CONCAT44(uVar55,uVar53) + 0x300) + 0x39));
              uVar18 = local_90[0]._M_local_buf[8];
              pMVar40 = pMVar41;
              if (local_90[0]._M_local_buf[8] == 1) {
                local_f0 = (undefined1  [8])&local_e0;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_f0,"package RBF failed: insufficient anti-DoS fees","");
                limits = (char *)&__dnew_1;
                bVar21 = ValidationState<PackageValidationResult>::Invalid
                                   (&package_state.super_ValidationState<PackageValidationResult>,
                                    PCKG_POLICY,(string *)local_f0,(string *)limits);
                uVar43 = (ulong)bVar21;
                pMVar40 = pMVar41;
                if (local_f0 != (undefined1  [8])&local_e0) {
                  operator_delete((void *)local_f0,local_e0._M_allocated_capacity + 1);
                  pMVar40 = pMVar41;
                }
              }
              if (((local_90[0]._M_local_buf[8] & 1) != 0) &&
                 (local_90[0]._M_local_buf[8] = 0, (undefined1 *)__dnew_1 != auStack_a0 + 8)) {
                operator_delete((void *)__dnew_1,(ulong)(auStack_a0._8_8_ + 1));
              }
              if (uVar18 == 0) {
                CFeeRate::CFeeRate(&parent_feerate,(CAmount *)(CONCAT44(uVar55,uVar53) + 0xb0),
                                   *(uint32_t *)(CONCAT44(uVar55,uVar53) + 0xa0));
                CFeeRate::CFeeRate(&package_feerate_1,&nFeePaid->m_total_modified_fees,
                                   (uint32_t)*piVar42);
                if (parent_feerate.nSatoshisPerK < package_feerate_1.nSatoshisPerK) {
                  ImprovesFeerateDiagram_abi_cxx11_
                            ((optional<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&__dnew_1,pMVar40->m_pool,(setEntries *)&err,
                             (setEntries *)all_conflicts,
                             (pMVar40->m_subpackage).m_total_modified_fees,
                             (pMVar40->m_subpackage).m_total_vsize);
                  uVar18 = local_90[1]._0_1_;
                  limits = (char *)all_conflicts;
                  if (local_90[1]._0_1_ == 1) {
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_f0,"package RBF failed: ",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)auStack_a0);
                    local_150 = (char *)0x0;
                    local_148._M_local_buf[0] = '\0';
                    limits = local_158;
                    local_158 = (undefined1  [8])&local_148;
                    bVar21 = ValidationState<PackageValidationResult>::Invalid
                                       (&package_state.
                                         super_ValidationState<PackageValidationResult>,PCKG_POLICY,
                                        (string *)local_f0,(string *)limits);
                    uVar43 = (ulong)bVar21;
                    if (local_158 != (undefined1  [8])&local_148) {
                      operator_delete((void *)local_158,
                                      CONCAT71(local_148._M_allocated_capacity._1_7_,
                                               local_148._M_local_buf[0]) + 1);
                    }
                    if (local_f0 != (undefined1  [8])&local_e0) {
                      operator_delete((void *)local_f0,local_e0._M_allocated_capacity + 1);
                    }
                  }
                  if (((local_90[1]._0_1_ & 1) != 0) &&
                     (local_90[1]._0_1_ = 0,
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)auStack_a0._0_8_ != local_90)) {
                    operator_delete((void *)auStack_a0._0_8_,(ulong)(local_90[0]._0_8_ + 1));
                  }
                  if (uVar18 == 0) {
                    pLVar35 = LogInstance();
                    bVar21 = BCLog::Logger::WillLogCategoryLevel(pLVar35,TXPACKAGES,Debug);
                    uVar43 = 1;
                    if (bVar21) {
                      puVar14 = (undefined8 *)CONCAT71(uVar58,uVar57);
                      base_blob<256u>::ToString_abi_cxx11_
                                ((string *)&__dnew_1,(void *)(*(long *)*puVar14 + 0x39));
                      base_blob<256u>::ToString_abi_cxx11_
                                ((string *)local_f0,(void *)(*(long *)*puVar14 + 0x59));
                      base_blob<256u>::ToString_abi_cxx11_
                                ((string *)local_158,(void *)(*(long *)(puVar14[1] + -0x10) + 0x39))
                      ;
                      base_blob<256u>::ToString_abi_cxx11_
                                ((string *)&effective_feerate_wtxids_1,
                                 (void *)(*(long *)(puVar14[1] + -0x10) + 0x59));
                      source_file_00._M_str =
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ;
                      source_file_00._M_len = 0x5e;
                      limits = 
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ;
                      logging_function_00._M_str = "PackageMempoolChecks";
                      logging_function_00._M_len = 0x14;
                      LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                                (logging_function_00,source_file_00,0x4c5,TXPACKAGES,Debug,
                                 (ConstevalFormatString<4U>)0xfb547c,(string *)&__dnew_1,
                                 (string *)local_f0,(string *)local_158,
                                 (string *)&effective_feerate_wtxids_1);
                      if (effective_feerate_wtxids_1.
                          super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start !=
                          (pointer)&effective_feerate_wtxids_1.
                                    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        operator_delete(effective_feerate_wtxids_1.
                                        super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        CONCAT71(effective_feerate_wtxids_1.
                                                 super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                                 _1_7_,effective_feerate_wtxids_1.
                                                                                                              
                                                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._0_1_) + 1);
                      }
                      if (local_158 != (undefined1  [8])&local_148) {
                        operator_delete((void *)local_158,
                                        CONCAT71(local_148._M_allocated_capacity._1_7_,
                                                 local_148._M_local_buf[0]) + 1);
                      }
                      if (local_f0 != (undefined1  [8])&local_e0) {
                        operator_delete((void *)local_f0,local_e0._M_allocated_capacity + 1);
                      }
                      if ((undefined1 *)__dnew_1 != auStack_a0 + 8) {
                        operator_delete((void *)__dnew_1,(ulong)(auStack_a0._8_8_ + 1));
                      }
                      uVar43 = 1;
                    }
                  }
                }
                else {
                  __dnew_1 = (size_type)(auStack_a0 + 8);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&__dnew_1,
                             "package RBF failed: package feerate is less than or equal to parent feerate"
                             ,"");
                  local_944 = BTC_KVB;
                  CFeeRate::ToString_abi_cxx11_((string *)local_158,&package_feerate_1,&local_944);
                  local_948 = BTC_KVB;
                  CFeeRate::ToString_abi_cxx11_
                            ((string *)&effective_feerate_wtxids_1,&parent_feerate,&local_948);
                  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                            ((string *)local_f0,
                             (tinyformat *)"package feerate %s <= parent feerate is %s",local_158,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &effective_feerate_wtxids_1,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             relay_fee.nSatoshisPerK);
                  limits = local_f0;
                  bVar21 = ValidationState<PackageValidationResult>::Invalid
                                     (&package_state.super_ValidationState<PackageValidationResult>,
                                      PCKG_POLICY,(string *)&__dnew_1,(string *)limits);
                  uVar43 = (ulong)bVar21;
                  if (local_f0 != (undefined1  [8])&local_e0) {
                    operator_delete((void *)local_f0,local_e0._M_allocated_capacity + 1);
                  }
                  if (effective_feerate_wtxids_1.
                      super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                      (pointer)&effective_feerate_wtxids_1.
                                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    operator_delete(effective_feerate_wtxids_1.
                                    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    CONCAT71(effective_feerate_wtxids_1.
                                             super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                             _1_7_,effective_feerate_wtxids_1.
                                                                                                      
                                                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._0_1_) + 1);
                  }
                  if (local_158 != (undefined1  [8])&local_148) {
                    operator_delete((void *)local_158,
                                    CONCAT71(local_148._M_allocated_capacity._1_7_,
                                             local_148._M_local_buf[0]) + 1);
                  }
                  if ((undefined1 *)__dnew_1 != auStack_a0 + 8) {
                    operator_delete((void *)__dnew_1,(ulong)(auStack_a0._8_8_ + 1));
                  }
                }
              }
            }
            std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&err);
            std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
            ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)&result);
            pWVar38 = extraout_RDX_22;
            pWVar25 = local_968.
                      super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pWVar28 = local_968.
                      super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((uVar43 & 1) != 0) goto LAB_00af4807;
          }
          else {
            err.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x16;
            __dnew_1 = (size_type)(auStack_a0 + 8);
            __dnew_1 = (size_type)
                       std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&__dnew_1,(size_type *)&err,0);
            auStack_a0._8_8_ =
                 err.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_dataplus._M_p;
            builtin_strncpy((char *)__dnew_1,"package-mempool-limits",0x16);
            auStack_a0._0_8_ =
                 err.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_dataplus._M_p;
            *(char *)(__dnew_1 +
                     (long)err.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload._M_value._M_dataplus._M_p) = '\0';
            util::ErrorString<void>((bilingual_str *)&err,&result);
            limits = (char *)&err;
            bVar21 = ValidationState<PackageValidationResult>::Invalid
                               (&package_state.super_ValidationState<PackageValidationResult>,
                                PCKG_POLICY,(string *)&__dnew_1,(string *)limits);
            pMVar40 = pMVar41;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)err.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._32_8_ != &local_700) {
              operator_delete((void *)err.
                                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ._32_8_,(ulong)(local_700._M_allocated_capacity + 1));
              pMVar40 = pMVar41;
            }
            if (err.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_payload._M_value._M_dataplus._M_p !=
                (pointer)((long)&err.
                                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                 ._M_payload.
                                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ._M_payload + 0x10)) {
              operator_delete((void *)err.
                                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ._M_payload._M_value._M_dataplus._M_p,
                              err.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload._16_8_ + 1);
            }
            if ((undefined1 *)__dnew_1 != auStack_a0 + 8) {
              operator_delete((void *)__dnew_1,(ulong)(auStack_a0._8_8_ + 1));
            }
            std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
            ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)&result);
            pWVar38 = extraout_RDX_02;
LAB_00af47f9:
            pWVar28 = (pointer)CONCAT44(uVar55,uVar53);
            if (bVar21 != false) goto LAB_00af4807;
          }
          local_7c0._0_4_ = package_state.super_ValidationState<PackageValidationResult>.m_mode;
          local_7c0._4_4_ = package_state.super_ValidationState<PackageValidationResult>.m_result;
          plVar50 = local_7a8;
          local_7b8 = plVar50;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_7b8,
                     package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                     _M_dataplus._M_p,
                     package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                     _M_dataplus._M_p +
                     package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                     _M_string_length);
          local_798[0] = local_788;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_798,
                     package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                     _M_dataplus._M_p,
                     package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                     _M_dataplus._M_p +
                     package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                     _M_string_length);
          state_15.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p.
          _0_4_ = uVar53;
          state_15.super_ValidationState<PackageValidationResult>._0_8_ = pMVar40;
          state_15.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p.
          _4_4_ = uVar55;
          state_15.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
               __n;
          state_15.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity = (size_type)args_00;
          state_15.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
          _M_local_buf[8] = uVar57;
          state_15.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._9_7_ =
               uVar58;
          state_15.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
               (pointer)__return_storage_ptr__;
          state_15.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length.
          _0_4_ = (int)nFeePaid;
          state_15.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length.
          _4_4_ = (int)((ulong)nFeePaid >> 0x20);
          state_15.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
          _M_allocated_capacity = (size_type)in_stack_fffffffffffff650;
          state_15.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
               in_stack_fffffffffffff658;
          PackageMempoolAcceptResult::PackageMempoolAcceptResult
                    (__return_storage_ptr__,state_15,
                     (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                      *)local_7c0);
          plVar45 = local_7b8;
          if (local_798[0] != local_788) {
            operator_delete(local_798[0],local_788[0] + 1);
            plVar45 = local_7b8;
          }
        }
LAB_00af65fa:
        if (plVar45 != plVar50) {
LAB_00af6607:
          operator_delete(plVar45,*plVar50 + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)placeholder_state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus
             ._M_p !=
          &placeholder_state.super_ValidationState<TxValidationResult>.m_debug_message.field_2) {
        operator_delete(placeholder_state.super_ValidationState<TxValidationResult>.m_debug_message.
                        _M_dataplus._M_p,
                        CONCAT71(placeholder_state.super_ValidationState<TxValidationResult>.
                                 m_debug_message.field_2._M_allocated_capacity._1_7_,
                                 placeholder_state.super_ValidationState<TxValidationResult>.
                                 m_debug_message.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)placeholder_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus
             ._M_p !=
          &placeholder_state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2) {
        operator_delete(placeholder_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                        _M_dataplus._M_p,
                        CONCAT71(placeholder_state.super_ValidationState<TxValidationResult>.
                                 m_reject_reason.field_2._M_allocated_capacity._1_7_,
                                 placeholder_state.super_ValidationState<TxValidationResult>.
                                 m_reject_reason.field_2._M_local_buf[0]) + 1);
      }
      if (all_package_wtxids.
          super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        pbVar44 = (byte *)((long)all_package_wtxids.
                                 super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)all_package_wtxids.
                                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        uVar32 = all_package_wtxids.
                 super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        goto LAB_00af6666;
      }
    }
    else {
      mempool_ancestors = &pWVar31->m_ancestors;
      this = pMVar41;
      while( true ) {
        PackageTRUCChecks_abi_cxx11_
                  (&err,*(CTransactionRef **)(mempool_ancestors + 2),
                   *(int64_t *)
                    ((unique_ptr<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_> *)
                     (mempool_ancestors + 1) + 2),(Package *)CONCAT71(uVar58,uVar57),
                   mempool_ancestors);
        if (err.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged == true) break;
        pWVar28 = (pointer)(mempool_ancestors + 10);
        pWVar31 = local_968.
                  super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        mempool_ancestors = mempool_ancestors + 0xc;
        pWVar25 = local_968.
                  super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pMVar41 = this;
        if (pWVar28 == pWVar49) goto LAB_00af35a8;
      }
      pvVar15 = (void *)((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x10);
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
      _M_storage[0] = (uchar)pvVar15;
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
           (undefined7)((ulong)pvVar15 >> 8);
      std::__cxx11::string::_M_construct<char_const*>((string *)&result,"TRUC-violation","");
      if (err.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged == false) goto LAB_00af6774;
      ValidationState<PackageValidationResult>::Invalid
                (&package_state.super_ValidationState<PackageValidationResult>,PCKG_POLICY,
                 (string *)&result,(string *)&err);
      if ((void *)CONCAT71(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                           super__Move_assign_alias<bilingual_str,_std::monostate>.
                           super__Copy_assign_alias<bilingual_str,_std::monostate>.
                           super__Move_ctor_alias<bilingual_str,_std::monostate>.
                           super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                           super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_,
                           result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                           super__Move_assign_alias<bilingual_str,_std::monostate>.
                           super__Copy_assign_alias<bilingual_str,_std::monostate>.
                           super__Move_ctor_alias<bilingual_str,_std::monostate>.
                           super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                           super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first
                           ._M_storage._M_storage[0]) != pvVar15) {
        operator_delete((void *)CONCAT71(result.m_variant.
                                         super__Variant_base<bilingual_str,_std::monostate>.
                                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                         super__Variant_storage_alias<bilingual_str,_std::monostate>
                                         ._M_u._1_7_,
                                         result.m_variant.
                                         super__Variant_base<bilingual_str,_std::monostate>.
                                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                         super__Variant_storage_alias<bilingual_str,_std::monostate>
                                         ._M_u._M_first._M_storage._M_storage[0]),
                        CONCAT71(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>
                                 .super__Move_assign_alias<bilingual_str,_std::monostate>.
                                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                 super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                 _17_7_,result.m_variant.
                                        super__Variant_base<bilingual_str,_std::monostate>.
                                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                        super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                        _M_u._M_first._M_storage._M_storage[0x10]) + 1);
      }
      local_5c0._0_4_ = package_state.super_ValidationState<PackageValidationResult>.m_mode;
      local_5c0._4_4_ = package_state.super_ValidationState<PackageValidationResult>.m_result;
      local_5b8 = local_5a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_5b8,
                 package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                 _M_dataplus._M_p,
                 package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                 _M_dataplus._M_p +
                 package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                 _M_string_length);
      local_598[0] = local_588;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_598,
                 package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                 _M_dataplus._M_p,
                 package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                 _M_dataplus._M_p +
                 package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                 _M_string_length);
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ =
           (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate> + 8;
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
      _M_storage[0] = '\0';
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ = 0;
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_4_ = 0;
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ = 0;
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
      _M_storage[0x10] = '\0';
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ = 0;
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
      _M_storage[0x18] =
           (uchar)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_;
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
           (undefined7)
           ((ulong)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                   super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ >> 8);
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._40_8_ = 0;
      state_02.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p._0_4_
           = in_stack_fffffffffffff620;
      state_02.super_ValidationState<PackageValidationResult>._0_8_ = this;
      state_02.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p._4_4_
           = in_stack_fffffffffffff624;
      state_02.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
           (size_type)in_stack_fffffffffffff628;
      state_02.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
      _M_allocated_capacity = (size_type)args_00;
      state_02.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._M_local_buf
      [8] = uVar57;
      state_02.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._9_7_ = uVar58
      ;
      state_02.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
           (pointer)__return_storage_ptr__;
      state_02.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length._0_4_
           = in_stack_fffffffffffff648;
      state_02.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length._4_4_
           = in_stack_fffffffffffff64c;
      state_02.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
      _M_allocated_capacity = (size_type)in_stack_fffffffffffff650;
      state_02.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
           in_stack_fffffffffffff658;
      PackageMempoolAcceptResult::PackageMempoolAcceptResult
                (__return_storage_ptr__,state_02,
                 (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                  *)local_5c0);
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
      ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                   *)&result);
      if (local_598[0] != local_588) {
        operator_delete(local_598[0],local_588[0] + 1);
      }
      if (local_5b8 != local_5a8) {
        operator_delete(local_5b8,(ulong)((long)&local_5a8[0]->_M_color + 1));
      }
      if ((err.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_engaged != true) ||
         (err.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._32_8_ = err.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._32_8_ & 0xffffffffffffff00,
         local_4d0[0] = (_Base_ptr)
                        err.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._16_8_,
         uVar32 = err.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload._M_value._M_dataplus._M_p,
         err.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._M_value._M_dataplus._M_p ==
         (pointer)((long)&err.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload + 0x10))) goto LAB_00af666b;
LAB_00af40a0:
      pbVar44 = (byte *)((long)&local_4d0[0]->_M_color + 1);
LAB_00af6666:
      operator_delete((void *)uVar32,(ulong)pbVar44);
    }
LAB_00af666b:
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock8.super_unique_lock);
    std::
    _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
    ::~_Rb_tree(&results._M_t);
    std::
    vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ::~vector(&local_968);
  }
  else {
    local_428._0_4_ = package_state.super_ValidationState<PackageValidationResult>.m_mode;
    local_428._4_4_ = package_state.super_ValidationState<PackageValidationResult>.m_result;
    local_420 = local_410;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_420,
               package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
               _M_dataplus._M_p,
               package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
               _M_dataplus._M_p +
               package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
               _M_string_length);
    local_400[0] = local_3f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_400,
               package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
               _M_dataplus._M_p,
               package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
               _M_dataplus._M_p +
               package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
               _M_string_length);
    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ =
         (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate> + 8;
    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage._M_storage
    [0] = '\0';
    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ = 0;
    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_4_ = 0;
    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ = 0;
    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage._M_storage
    [0x10] = '\0';
    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ = 0;
    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage._M_storage
    [0x18] = (uchar)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_;
    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
         (undefined7)
         ((ulong)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ >> 8);
    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._40_8_ = 0;
    state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p._0_4_ =
         in_stack_fffffffffffff620;
    state.super_ValidationState<PackageValidationResult>.m_mode = (int)in_stack_fffffffffffff618;
    state.super_ValidationState<PackageValidationResult>.m_result =
         (int)((ulong)in_stack_fffffffffffff618 >> 0x20);
    state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p._4_4_ =
         in_stack_fffffffffffff624;
    state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
         (size_type)in_stack_fffffffffffff628;
    state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
    _M_allocated_capacity = in_stack_fffffffffffff630;
    state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._M_local_buf[8] =
         uVar57;
    state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._9_7_ = uVar58;
    state.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)__return_storage_ptr__;
    state.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length._0_4_ =
         in_stack_fffffffffffff648;
    state.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length._4_4_ =
         in_stack_fffffffffffff64c;
    state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
    _M_allocated_capacity = (size_type)in_stack_fffffffffffff650;
    state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
         in_stack_fffffffffffff658;
    PackageMempoolAcceptResult::PackageMempoolAcceptResult
              (__return_storage_ptr__,state,
               (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                *)local_428);
    std::
    _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
    ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                 *)&result);
    if (local_400[0] != local_3f0) {
      operator_delete(local_400[0],local_3f0[0] + 1);
    }
    if (local_420 != local_410) {
      operator_delete(local_420,(ulong)((long)&local_410[0]->_M_color + 1));
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)package_state.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus.
         _M_p !=
      &package_state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2) {
    operator_delete(package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                    _M_dataplus._M_p,
                    CONCAT71(package_state.super_ValidationState<PackageValidationResult>.
                             m_debug_message.field_2._M_allocated_capacity._1_7_,
                             package_state.super_ValidationState<PackageValidationResult>.
                             m_debug_message.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)package_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
         _M_p !=
      &package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2) {
    operator_delete(package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                    _M_dataplus._M_p,
                    CONCAT71(package_state.super_ValidationState<PackageValidationResult>.
                             m_reject_reason.field_2._M_allocated_capacity._1_7_,
                             package_state.super_ValidationState<PackageValidationResult>.
                             m_reject_reason.field_2._M_local_buf[0]) + 1);
  }
  if (*(PackageMempoolAcceptResult **)(in_FS_OFFSET + 0x28) == pPVar5) {
    return *(PackageMempoolAcceptResult **)(in_FS_OFFSET + 0x28);
  }
LAB_00af7567:
  __stack_chk_fail();
LAB_00af6735:
  if (*(PackageMempoolAcceptResult **)(in_FS_OFFSET + 0x28) == pPVar5) {
    std::__throw_bad_optional_access();
  }
  goto LAB_00af7567;
}

Assistant:

PackageMempoolAcceptResult MemPoolAccept::AcceptMultipleTransactions(const std::vector<CTransactionRef>& txns, ATMPArgs& args)
{
    AssertLockHeld(cs_main);

    // These context-free package limits can be done before taking the mempool lock.
    PackageValidationState package_state;
    if (!IsWellFormedPackage(txns, package_state, /*require_sorted=*/true)) return PackageMempoolAcceptResult(package_state, {});

    std::vector<Workspace> workspaces{};
    workspaces.reserve(txns.size());
    std::transform(txns.cbegin(), txns.cend(), std::back_inserter(workspaces),
                   [](const auto& tx) { return Workspace(tx); });
    std::map<uint256, MempoolAcceptResult> results;

    LOCK(m_pool.cs);

    // Do all PreChecks first and fail fast to avoid running expensive script checks when unnecessary.
    for (Workspace& ws : workspaces) {
        if (!PreChecks(args, ws)) {
            package_state.Invalid(PackageValidationResult::PCKG_TX, "transaction failed");
            // Exit early to avoid doing pointless work. Update the failed tx result; the rest are unfinished.
            results.emplace(ws.m_ptx->GetWitnessHash(), MempoolAcceptResult::Failure(ws.m_state));
            return PackageMempoolAcceptResult(package_state, std::move(results));
        }

        // Individual modified feerate exceeded caller-defined max; abort
        // N.B. this doesn't take into account CPFPs. Chunk-aware validation may be more robust.
        if (args.m_client_maxfeerate && CFeeRate(ws.m_modified_fees, ws.m_vsize) > args.m_client_maxfeerate.value()) {
            // Need to set failure here both individually and at package level
            ws.m_state.Invalid(TxValidationResult::TX_MEMPOOL_POLICY, "max feerate exceeded", "");
            package_state.Invalid(PackageValidationResult::PCKG_TX, "transaction failed");
            // Exit early to avoid doing pointless work. Update the failed tx result; the rest are unfinished.
            results.emplace(ws.m_ptx->GetWitnessHash(), MempoolAcceptResult::Failure(ws.m_state));
            return PackageMempoolAcceptResult(package_state, std::move(results));
        }

        // Make the coins created by this transaction available for subsequent transactions in the
        // package to spend. If there are no conflicts within the package, no transaction can spend a coin
        // needed by another transaction in the package. We also need to make sure that no package
        // tx replaces (or replaces the ancestor of) the parent of another package tx. As long as we
        // check these two things, we don't need to track the coins spent.
        // If a package tx conflicts with a mempool tx, PackageMempoolChecks() ensures later that any package RBF attempt
        // has *no* in-mempool ancestors, so we don't have to worry about subsequent transactions in
        // same package spending the same in-mempool outpoints. This needs to be revisited for general
        // package RBF.
        m_viewmempool.PackageAddTransaction(ws.m_ptx);
    }

    // At this point we have all in-mempool ancestors, and we know every transaction's vsize.
    // Run the TRUC checks on the package.
    for (Workspace& ws : workspaces) {
        if (auto err{PackageTRUCChecks(ws.m_ptx, ws.m_vsize, txns, ws.m_ancestors)}) {
            package_state.Invalid(PackageValidationResult::PCKG_POLICY, "TRUC-violation", err.value());
            return PackageMempoolAcceptResult(package_state, {});
        }
    }

    // Transactions must meet two minimum feerates: the mempool minimum fee and min relay fee.
    // For transactions consisting of exactly one child and its parents, it suffices to use the
    // package feerate (total modified fees / total virtual size) to check this requirement.
    // Note that this is an aggregate feerate; this function has not checked that there are transactions
    // too low feerate to pay for themselves, or that the child transactions are higher feerate than
    // their parents. Using aggregate feerate may allow "parents pay for child" behavior and permit
    // a child that is below mempool minimum feerate. To avoid these behaviors, callers of
    // AcceptMultipleTransactions need to restrict txns topology (e.g. to ancestor sets) and check
    // the feerates of individuals and subsets.
    m_subpackage.m_total_vsize = std::accumulate(workspaces.cbegin(), workspaces.cend(), int64_t{0},
        [](int64_t sum, auto& ws) { return sum + ws.m_vsize; });
    m_subpackage.m_total_modified_fees = std::accumulate(workspaces.cbegin(), workspaces.cend(), CAmount{0},
        [](CAmount sum, auto& ws) { return sum + ws.m_modified_fees; });
    const CFeeRate package_feerate(m_subpackage.m_total_modified_fees, m_subpackage.m_total_vsize);
    std::vector<Wtxid> all_package_wtxids;
    all_package_wtxids.reserve(workspaces.size());
    std::transform(workspaces.cbegin(), workspaces.cend(), std::back_inserter(all_package_wtxids),
                   [](const auto& ws) { return ws.m_ptx->GetWitnessHash(); });
    TxValidationState placeholder_state;
    if (args.m_package_feerates &&
        !CheckFeeRate(m_subpackage.m_total_vsize, m_subpackage.m_total_modified_fees, placeholder_state)) {
        package_state.Invalid(PackageValidationResult::PCKG_TX, "transaction failed");
        return PackageMempoolAcceptResult(package_state, {{workspaces.back().m_ptx->GetWitnessHash(),
            MempoolAcceptResult::FeeFailure(placeholder_state, CFeeRate(m_subpackage.m_total_modified_fees, m_subpackage.m_total_vsize), all_package_wtxids)}});
    }

    // Apply package mempool ancestor/descendant limits. Skip if there is only one transaction,
    // because it's unnecessary.
    if (txns.size() > 1 && !PackageMempoolChecks(txns, workspaces, m_subpackage.m_total_vsize, package_state)) {
        return PackageMempoolAcceptResult(package_state, std::move(results));
    }

    for (Workspace& ws : workspaces) {
        ws.m_package_feerate = package_feerate;
        if (!PolicyScriptChecks(args, ws)) {
            // Exit early to avoid doing pointless work. Update the failed tx result; the rest are unfinished.
            package_state.Invalid(PackageValidationResult::PCKG_TX, "transaction failed");
            results.emplace(ws.m_ptx->GetWitnessHash(), MempoolAcceptResult::Failure(ws.m_state));
            return PackageMempoolAcceptResult(package_state, std::move(results));
        }
        if (args.m_test_accept) {
            const auto effective_feerate = args.m_package_feerates ? ws.m_package_feerate :
                CFeeRate{ws.m_modified_fees, static_cast<uint32_t>(ws.m_vsize)};
            const auto effective_feerate_wtxids = args.m_package_feerates ? all_package_wtxids :
                std::vector<Wtxid>{ws.m_ptx->GetWitnessHash()};
            results.emplace(ws.m_ptx->GetWitnessHash(),
                            MempoolAcceptResult::Success(std::move(m_subpackage.m_replaced_transactions),
                                                         ws.m_vsize, ws.m_base_fees, effective_feerate,
                                                         effective_feerate_wtxids));
        }
    }

    if (args.m_test_accept) return PackageMempoolAcceptResult(package_state, std::move(results));

    if (!SubmitPackage(args, workspaces, package_state, results)) {
        // PackageValidationState filled in by SubmitPackage().
        return PackageMempoolAcceptResult(package_state, std::move(results));
    }

    return PackageMempoolAcceptResult(package_state, std::move(results));
}